

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse2::BVHNIntersector1<4,_1,_false,_embree::sse2::SubGridIntersector1Moeller<4,_true>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  Intersector1 *pIVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  ulong uVar9;
  Geometry *pGVar10;
  long lVar11;
  Scene *pSVar12;
  RTCFilterFunctionN p_Var13;
  RTCRayQueryContext *pRVar14;
  IntersectFunc4 p_Var15;
  Device *pDVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  undefined2 uVar20;
  undefined2 uVar21;
  undefined2 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  byte bVar28;
  undefined1 auVar29 [14];
  undefined1 auVar30 [14];
  undefined1 auVar31 [14];
  undefined1 auVar32 [14];
  unkbyte10 Var33;
  undefined1 auVar34 [12];
  undefined1 auVar35 [14];
  undefined1 auVar36 [12];
  undefined1 auVar37 [14];
  undefined1 auVar38 [12];
  undefined1 auVar39 [14];
  undefined1 auVar40 [12];
  undefined1 auVar41 [14];
  undefined1 auVar42 [12];
  undefined1 auVar43 [14];
  undefined1 auVar44 [12];
  undefined1 auVar45 [14];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [14];
  undefined1 auVar49 [12];
  undefined1 (*pauVar50) [16];
  undefined4 uVar51;
  undefined1 (*pauVar52) [16];
  long lVar53;
  Scene *pSVar54;
  Intersectors *pIVar55;
  int iVar56;
  ulong uVar57;
  Intersectors *pIVar58;
  RTCRayHit4 *extraout_RDX;
  RTCRayHit4 *extraout_RDX_00;
  RTCRayHit4 *pRVar59;
  RTCRayHit4 *extraout_RDX_01;
  RTCRayHit4 *extraout_RDX_02;
  Intersectors *pIVar60;
  ulong uVar61;
  ulong uVar62;
  long lVar63;
  Intersectors *pIVar64;
  ulong uVar65;
  long lVar66;
  ulong uVar67;
  ulong uVar68;
  long lVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  byte bVar75;
  char cVar76;
  byte bVar98;
  byte bVar100;
  char cVar102;
  char cVar103;
  char cVar104;
  char cVar105;
  byte bVar107;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  char cVar99;
  char cVar101;
  undefined1 auVar84 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined2 uVar289;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar121 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined2 uVar290;
  float fVar136;
  float fVar160;
  float fVar161;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar151 [16];
  undefined1 auVar154 [16];
  float fVar162;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined2 uVar291;
  undefined2 uVar292;
  float fVar197;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar177 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined2 uVar293;
  float fVar203;
  float fVar220;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  float fVar221;
  undefined1 auVar219 [16];
  undefined2 uVar294;
  undefined1 auVar231 [16];
  undefined1 auVar234 [16];
  float fVar235;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar236 [16];
  undefined1 in_XMM8_Ba;
  undefined1 in_XMM8_Bb;
  undefined1 in_XMM8_Bc;
  undefined1 in_XMM8_Bd;
  undefined1 in_XMM8_Be;
  undefined1 in_XMM8_Bf;
  undefined1 in_XMM8_Bg;
  undefined1 in_XMM8_Bh;
  float fVar241;
  float fVar244;
  float fVar245;
  undefined1 auVar242 [16];
  float fVar246;
  undefined1 auVar243 [16];
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  uint uVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  uint uVar261;
  float fVar262;
  uint uVar263;
  float fVar264;
  uint uVar265;
  float fVar266;
  uint uVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_130c [4];
  undefined1 local_1308 [8];
  float fStack_1300;
  float fStack_12fc;
  undefined8 local_12f8;
  Intersectors *local_12f0;
  undefined8 local_12e8;
  float fStack_12e0;
  float fStack_12dc;
  undefined4 uStack_12d8;
  float fStack_12d4;
  RTCRayHit4 *local_12d0;
  undefined8 local_12c8;
  float fStack_12c0;
  float fStack_12bc;
  undefined8 local_12b8;
  float fStack_12b0;
  float fStack_12ac;
  ulong local_12a8;
  ulong local_12a0;
  undefined8 local_1298;
  float fStack_1290;
  float fStack_128c;
  float local_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float local_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  undefined1 local_1258 [16];
  RTCFilterFunctionNArguments local_1248;
  int local_1218;
  float local_1214;
  float local_1210;
  float local_120c;
  float local_1208;
  undefined4 local_1204;
  undefined4 local_1200;
  undefined4 local_11fc;
  undefined4 local_11f8;
  undefined1 local_11e8 [8];
  float fStack_11e0;
  float fStack_11dc;
  long local_11d0;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  undefined8 local_11b8;
  float fStack_11b0;
  float fStack_11ac;
  undefined8 local_11a8;
  float fStack_11a0;
  float fStack_119c;
  undefined8 local_1198;
  float fStack_1190;
  float fStack_118c;
  undefined1 local_1188 [8];
  undefined8 uStack_1180;
  undefined1 local_1178 [8];
  float fStack_1170;
  float fStack_116c;
  undefined1 local_1168 [8];
  float fStack_1160;
  float fStack_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  undefined1 local_1148 [8];
  float fStack_1140;
  float fStack_113c;
  undefined1 local_1128 [16];
  float local_1118 [4];
  float local_1108 [4];
  float local_10f8 [4];
  undefined1 local_10e8 [8];
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8 [4];
  float local_10c8 [2];
  undefined8 uStack_10c0;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  ulong local_10a0;
  ulong local_1098;
  ulong local_1090;
  ulong local_1088;
  ulong local_1080;
  ulong local_1078;
  ulong local_1070;
  long local_1068;
  long local_1060;
  ulong local_1058;
  Intersectors *local_1050;
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  uint local_1018;
  uint uStack_1014;
  uint uStack_1010;
  uint uStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  undefined1 auVar85 [16];
  undefined1 auVar77 [11];
  undefined1 auVar86 [16];
  undefined1 auVar92 [16];
  undefined1 auVar78 [12];
  undefined1 auVar87 [16];
  undefined1 auVar79 [13];
  undefined1 auVar88 [16];
  undefined1 auVar93 [16];
  undefined1 auVar90 [16];
  undefined1 auVar89 [16];
  undefined2 uVar106;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar112 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar142 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar178 [16];
  undefined1 auVar190 [16];
  undefined1 auVar179 [16];
  undefined1 auVar191 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar176 [16];
  undefined1 auVar188 [16];
  undefined1 auVar168 [16];
  undefined1 auVar180 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar206 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar222 [16];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar52 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar203 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar136 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar268 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar270 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar284 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fVar197 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fVar237 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fVar240 = (ray->super_RayK<1>).dir.field_0.m128[3];
    fVar286 = 0.0;
    if (0.0 <= fVar270) {
      fVar286 = fVar270;
    }
    fVar270 = (ray->super_RayK<1>).tfar;
    fVar160 = 0.0;
    if (0.0 <= fVar270) {
      fVar160 = fVar270;
    }
    uVar71 = -(uint)((float)DAT_01f80d30 <= ABS(fVar284));
    uVar72 = -(uint)(DAT_01f80d30._4_4_ <= ABS(fVar197));
    uVar73 = -(uint)(DAT_01f80d30._8_4_ <= ABS(fVar237));
    uVar74 = -(uint)(DAT_01f80d30._12_4_ <= ABS(fVar240));
    auVar80._0_4_ = (uint)fVar284 & uVar71;
    auVar80._4_4_ = (uint)fVar197 & uVar72;
    auVar80._8_4_ = (uint)fVar237 & uVar73;
    auVar80._12_4_ = (uint)fVar240 & uVar74;
    auVar137._0_4_ = ~uVar71 & (uint)(float)DAT_01f80d30;
    auVar137._4_4_ = ~uVar72 & (uint)DAT_01f80d30._4_4_;
    auVar137._8_4_ = ~uVar73 & (uint)DAT_01f80d30._8_4_;
    auVar137._12_4_ = ~uVar74 & (uint)DAT_01f80d30._12_4_;
    auVar137 = auVar137 | auVar80;
    auVar108 = rcpps(auVar80,auVar137);
    fVar247 = auVar108._0_4_;
    fVar248 = auVar108._4_4_;
    fVar250 = auVar108._8_4_;
    fVar247 = (1.0 - auVar137._0_4_ * fVar247) * fVar247 + fVar247;
    fVar248 = (1.0 - auVar137._4_4_ * fVar248) * fVar248 + fVar248;
    fVar250 = (1.0 - auVar137._8_4_ * fVar250) * fVar250 + fVar250;
    uVar61 = (ulong)(fVar247 < 0.0) << 4;
    uVar68 = (ulong)(fVar248 < 0.0) << 4 | 0x20;
    uVar70 = (ulong)(fVar250 < 0.0) << 4 | 0x40;
    uVar65 = uVar61 ^ 0x10;
    uVar67 = uVar68 ^ 0x10;
    uVar62 = uVar70 ^ 0x10;
    auVar108._4_4_ = fVar286;
    auVar108._0_4_ = fVar286;
    auVar108._8_4_ = fVar286;
    auVar108._12_4_ = fVar286;
    auVar242._4_4_ = fVar160;
    auVar242._0_4_ = fVar160;
    auVar242._8_4_ = fVar160;
    auVar242._12_4_ = fVar160;
    local_1070 = (ulong)(((uint)(fVar247 < 0.0) << 4) >> 2);
    local_1078 = uVar65 >> 2;
    local_1080 = uVar68 >> 2;
    local_1088 = uVar67 >> 2;
    local_1090 = uVar70 >> 2;
    local_1098 = uVar62 >> 2;
    _local_1018 = mm_lookupmask_ps._240_8_;
    _uStack_1010 = mm_lookupmask_ps._248_8_;
    local_10b8 = fVar268;
    fStack_10b4 = fVar268;
    fStack_10b0 = fVar268;
    fStack_10ac = fVar268;
    local_11c8 = fVar203;
    fStack_11c4 = fVar203;
    fStack_11c0 = fVar203;
    fStack_11bc = fVar203;
    local_12d0 = (RTCRayHit4 *)context;
    local_12f0 = (Intersectors *)ray;
    local_1048 = auVar108;
    local_fd8 = fVar250;
    fStack_fd4 = fVar250;
    fStack_fd0 = fVar250;
    fStack_fcc = fVar250;
    local_fe8 = fVar136;
    fStack_fe4 = fVar136;
    fStack_fe0 = fVar136;
    fStack_fdc = fVar136;
    local_10a0 = uVar61;
    local_ff8 = fVar247;
    fStack_ff4 = fVar247;
    fStack_ff0 = fVar247;
    fStack_fec = fVar247;
    local_1008 = fVar248;
    fStack_1004 = fVar248;
    fStack_1000 = fVar248;
    fStack_ffc = fVar248;
    local_1058 = uVar68;
    local_12a0 = uVar70;
    fVar286 = fVar203;
    fVar270 = fVar203;
    fVar284 = fVar203;
    fVar197 = fVar268;
    fVar237 = fVar268;
    fVar240 = fVar268;
    fVar246 = fVar248;
    fVar245 = fVar248;
    fVar244 = fVar248;
    fVar241 = fVar247;
    fVar239 = fVar247;
    fVar238 = fVar247;
    fVar235 = fVar136;
    fVar221 = fVar136;
    fVar220 = fVar136;
    fVar162 = fVar250;
    fVar161 = fVar250;
    fVar160 = fVar250;
LAB_00d24aec:
    do {
      pauVar50 = pauVar52 + -1;
      pauVar52 = pauVar52 + -1;
      if (*(float *)((long)*pauVar50 + 8) <
          *(float *)&(((Intersectors *)ray)->intersector1).intersect ||
          *(float *)((long)*pauVar50 + 8) ==
          *(float *)&(((Intersectors *)ray)->intersector1).intersect) {
        pIVar60 = *(Intersectors **)*pauVar52;
        while (((ulong)pIVar60 & 8) == 0) {
          pfVar2 = (float *)((long)&(pIVar60->intersector1).intersect + uVar61);
          auVar139._0_4_ = (*pfVar2 - fVar203) * fVar238;
          auVar139._4_4_ = (pfVar2[1] - fVar286) * fVar239;
          auVar139._8_4_ = (pfVar2[2] - fVar270) * fVar241;
          auVar139._12_4_ = (pfVar2[3] - fVar284) * fVar247;
          pfVar2 = (float *)((long)&(pIVar60->intersector1).intersect + uVar68);
          auVar205._0_4_ = (*pfVar2 - fVar220) * fVar244;
          auVar205._4_4_ = (pfVar2[1] - fVar221) * fVar245;
          auVar205._8_4_ = (pfVar2[2] - fVar235) * fVar246;
          auVar205._12_4_ = (pfVar2[3] - fVar136) * fVar248;
          auVar80 = maxps(auVar139,auVar205);
          pfVar2 = (float *)((long)&(pIVar60->intersector1).intersect + uVar70);
          auVar109._0_4_ = (*pfVar2 - fVar268) * fVar160;
          auVar109._4_4_ = (pfVar2[1] - fVar197) * fVar161;
          auVar109._8_4_ = (pfVar2[2] - fVar237) * fVar162;
          auVar109._12_4_ = (pfVar2[3] - fVar240) * fVar250;
          pfVar2 = (float *)((long)&(pIVar60->intersector1).intersect + uVar65);
          auVar138._0_4_ = (*pfVar2 - fVar203) * fVar238;
          auVar138._4_4_ = (pfVar2[1] - fVar286) * fVar239;
          auVar138._8_4_ = (pfVar2[2] - fVar270) * fVar241;
          auVar138._12_4_ = (pfVar2[3] - fVar284) * fVar247;
          pfVar2 = (float *)((long)&(pIVar60->intersector1).intersect + uVar67);
          auVar163._0_4_ = (*pfVar2 - fVar220) * fVar244;
          auVar163._4_4_ = (pfVar2[1] - fVar221) * fVar245;
          auVar163._8_4_ = (pfVar2[2] - fVar235) * fVar246;
          auVar163._12_4_ = (pfVar2[3] - fVar136) * fVar248;
          auVar139 = minps(auVar138,auVar163);
          pfVar2 = (float *)((long)&(pIVar60->intersector1).intersect + uVar62);
          auVar164._0_4_ = (*pfVar2 - fVar268) * fVar160;
          auVar164._4_4_ = (pfVar2[1] - fVar197) * fVar161;
          auVar164._8_4_ = (pfVar2[2] - fVar237) * fVar162;
          auVar164._12_4_ = (pfVar2[3] - fVar240) * fVar250;
          auVar137 = maxps(auVar109,auVar108);
          _local_1178 = maxps(auVar80,auVar137);
          auVar80 = minps(auVar164,auVar242);
          auVar80 = minps(auVar139,auVar80);
          auVar199._4_4_ = -(uint)(local_1178._4_4_ <= auVar80._4_4_);
          auVar199._0_4_ = -(uint)(local_1178._0_4_ <= auVar80._0_4_);
          auVar199._8_4_ = -(uint)(local_1178._8_4_ <= auVar80._8_4_);
          auVar199._12_4_ = -(uint)(local_1178._12_4_ <= auVar80._12_4_);
          uVar71 = movmskps((int)This,auVar199);
          This = (Intersectors *)(ulong)uVar71;
          if (uVar71 == 0) {
            if (pauVar52 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d24aec;
          }
          uVar57 = (ulong)pIVar60 & 0xfffffffffffffff0;
          This = (Intersectors *)0x0;
          if ((byte)uVar71 != 0) {
            for (; ((byte)uVar71 >> (long)This & 1) == 0;
                This = (Intersectors *)((long)&((RefCount *)&This->ptr)->_vptr_RefCount + 1)) {
            }
          }
          pIVar60 = *(Intersectors **)(uVar57 + (long)This * 8);
          uVar71 = (uVar71 & 0xff) - 1 & uVar71 & 0xff;
          if (uVar71 != 0) {
            uVar72 = *(uint *)(local_1178 + (long)This * 4);
            lVar53 = 0;
            if (uVar71 != 0) {
              for (; (uVar71 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
              }
            }
            This = *(Intersectors **)(uVar57 + lVar53 * 8);
            uVar73 = *(uint *)(local_1178 + lVar53 * 4);
            uVar71 = uVar71 - 1 & uVar71;
            if (uVar71 == 0) {
              if (uVar72 < uVar73) {
                *(Intersectors **)*pauVar52 = This;
                *(uint *)((long)*pauVar52 + 8) = uVar73;
                pauVar52 = pauVar52 + 1;
              }
              else {
                *(Intersectors **)*pauVar52 = pIVar60;
                *(uint *)((long)*pauVar52 + 8) = uVar72;
                pauVar52 = pauVar52 + 1;
                pIVar60 = This;
              }
            }
            else {
              in_XMM8_Ba = auVar108[0];
              in_XMM8_Bb = auVar108[1];
              in_XMM8_Bc = auVar108[2];
              in_XMM8_Bd = auVar108[3];
              in_XMM8_Be = auVar108[4];
              in_XMM8_Bf = auVar108[5];
              in_XMM8_Bg = auVar108[6];
              in_XMM8_Bh = auVar108[7];
              auVar81._8_4_ = uVar72;
              auVar81._0_8_ = pIVar60;
              auVar81._12_4_ = 0;
              auVar110._8_4_ = uVar73;
              auVar110._0_8_ = This;
              auVar110._12_4_ = 0;
              This = (Intersectors *)0x0;
              if (uVar71 != 0) {
                for (; (uVar71 >> (long)This & 1) == 0;
                    This = (Intersectors *)((long)&((RefCount *)&This->ptr)->_vptr_RefCount + 1)) {
                }
              }
              uVar9 = *(ulong *)(uVar57 + (long)This * 8);
              iVar56 = *(int *)(local_1178 + (long)This * 4);
              auVar140._8_4_ = iVar56;
              auVar140._0_8_ = uVar9;
              auVar140._12_4_ = 0;
              auVar165._8_4_ = -(uint)((int)uVar72 < (int)uVar73);
              uVar71 = uVar71 - 1 & uVar71;
              fVar286 = fStack_11c4;
              fVar270 = fStack_11c0;
              fVar284 = fStack_11bc;
              fVar203 = local_11c8;
              if (uVar71 == 0) {
                auVar165._4_4_ = auVar165._8_4_;
                auVar165._0_4_ = auVar165._8_4_;
                auVar165._12_4_ = auVar165._8_4_;
                auVar80 = auVar81 & auVar165 | ~auVar165 & auVar110;
                auVar137 = auVar110 & auVar165 | ~auVar165 & auVar81;
                auVar166._8_4_ = -(uint)(auVar80._8_4_ < iVar56);
                auVar166._0_8_ = CONCAT44(auVar166._8_4_,auVar166._8_4_);
                auVar166._12_4_ = auVar166._8_4_;
                pIVar60 = (Intersectors *)(~auVar166._0_8_ & uVar9 | auVar80._0_8_ & auVar166._0_8_)
                ;
                auVar80 = auVar140 & auVar166 | ~auVar166 & auVar80;
                auVar82._8_4_ = -(uint)(auVar137._8_4_ < auVar80._8_4_);
                auVar82._4_4_ = auVar82._8_4_;
                auVar82._0_4_ = auVar82._8_4_;
                auVar82._12_4_ = auVar82._8_4_;
                *pauVar52 = ~auVar82 & auVar137 | auVar80 & auVar82;
                pauVar52[1] = auVar137 & auVar82 | ~auVar82 & auVar80;
                pauVar52 = pauVar52 + 2;
              }
              else {
                This = (Intersectors *)0x0;
                if (uVar71 != 0) {
                  for (; (uVar71 >> (long)This & 1) == 0;
                      This = (Intersectors *)((long)&((RefCount *)&This->ptr)->_vptr_RefCount + 1))
                  {
                  }
                }
                iVar8 = *(int *)(local_1178 + (long)This * 4);
                auVar198._8_4_ = iVar8;
                auVar198._0_8_ = *(undefined8 *)(uVar57 + (long)This * 8);
                auVar198._12_4_ = 0;
                auVar167._4_4_ = auVar165._8_4_;
                auVar167._0_4_ = auVar165._8_4_;
                auVar167._8_4_ = auVar165._8_4_;
                auVar167._12_4_ = auVar165._8_4_;
                auVar80 = auVar81 & auVar167 | ~auVar167 & auVar110;
                auVar137 = auVar110 & auVar167 | ~auVar167 & auVar81;
                auVar204._0_4_ = -(uint)(iVar56 < iVar8);
                auVar204._4_4_ = -(uint)(iVar56 < iVar8);
                auVar204._8_4_ = -(uint)(iVar56 < iVar8);
                auVar204._12_4_ = -(uint)(iVar56 < iVar8);
                auVar139 = auVar140 & auVar204 | ~auVar204 & auVar198;
                auVar205 = ~auVar204 & auVar140 | auVar198 & auVar204;
                auVar141._8_4_ = -(uint)(auVar137._8_4_ < auVar205._8_4_);
                auVar141._4_4_ = auVar141._8_4_;
                auVar141._0_4_ = auVar141._8_4_;
                auVar141._12_4_ = auVar141._8_4_;
                auVar199 = auVar137 & auVar141 | ~auVar141 & auVar205;
                auVar111._8_4_ = -(uint)(auVar80._8_4_ < auVar139._8_4_);
                auVar111._0_8_ = CONCAT44(auVar111._8_4_,auVar111._8_4_);
                auVar111._12_4_ = auVar111._8_4_;
                pIVar60 = (Intersectors *)
                          (auVar80._0_8_ & auVar111._0_8_ | ~auVar111._0_8_ & auVar139._0_8_);
                auVar80 = ~auVar111 & auVar80 | auVar139 & auVar111;
                auVar83._8_4_ = -(uint)(auVar80._8_4_ < auVar199._8_4_);
                auVar83._4_4_ = auVar83._8_4_;
                auVar83._0_4_ = auVar83._8_4_;
                auVar83._12_4_ = auVar83._8_4_;
                *pauVar52 = ~auVar141 & auVar137 | auVar205 & auVar141;
                pauVar52[1] = ~auVar83 & auVar80 | auVar199 & auVar83;
                pauVar52[2] = auVar80 & auVar83 | ~auVar83 & auVar199;
                pauVar52 = pauVar52 + 3;
                fVar268 = local_10b8;
                fVar197 = fStack_10b4;
                fVar237 = fStack_10b0;
                fVar240 = fStack_10ac;
              }
            }
          }
        }
        local_1068 = (ulong)((uint)pIVar60 & 0xf) - 8;
        if (local_1068 != 0) {
          uVar61 = (ulong)pIVar60 & 0xfffffffffffffff0;
          local_1060 = 0;
          local_fa8 = auVar242;
          do {
            lVar53 = local_1060 * 0x58;
            This = (Intersectors *)(uVar61 + lVar53);
            uVar5 = *(undefined8 *)(uVar61 + 0x20 + lVar53);
            uVar51 = *(undefined4 *)(uVar61 + 0x24 + lVar53);
            bVar107 = (byte)uVar5;
            bVar75 = (byte)uVar51;
            bVar17 = (byte)((ulong)uVar5 >> 8);
            bVar98 = (byte)((uint)uVar51 >> 8);
            bVar18 = (byte)((ulong)uVar5 >> 0x10);
            bVar100 = (byte)((uint)uVar51 >> 0x10);
            bVar28 = (byte)((uint)uVar51 >> 0x18);
            bVar19 = (byte)((ulong)uVar5 >> 0x18);
            cVar76 = -((byte)((bVar107 < bVar75) * bVar107 | (bVar107 >= bVar75) * bVar75) ==
                      bVar107);
            cVar99 = -((byte)((bVar17 < bVar98) * bVar17 | (bVar17 >= bVar98) * bVar98) == bVar17);
            cVar101 = -((byte)((bVar18 < bVar100) * bVar18 | (bVar18 >= bVar100) * bVar100) ==
                       bVar18);
            cVar102 = -((byte)((bVar19 < bVar28) * bVar19 | (bVar19 >= bVar28) * bVar28) == bVar19);
            cVar103 = -((char)((ulong)uVar5 >> 0x20) == '\0');
            cVar104 = -((char)((ulong)uVar5 >> 0x28) == '\0');
            cVar105 = -((char)((ulong)uVar5 >> 0x30) == '\0');
            bVar107 = -((char)((ulong)uVar5 >> 0x38) == '\0');
            auVar85._0_9_ = CONCAT18(0xff,(ulong)bVar107 << 0x38);
            auVar77._0_10_ = CONCAT19(0xff,auVar85._0_9_);
            auVar77[10] = 0xff;
            auVar78[0xb] = 0xff;
            auVar78._0_11_ = auVar77;
            auVar79[0xc] = 0xff;
            auVar79._0_12_ = auVar78;
            auVar90[0xd] = 0xff;
            auVar90._0_13_ = auVar79;
            fVar286 = *(float *)(uVar61 + 0x38 + lVar53);
            fVar203 = *(float *)(uVar61 + 0x3c + lVar53);
            fVar268 = *(float *)(uVar61 + 0x44 + lVar53);
            uVar71 = *(uint *)((long)&(This->intersector1).intersect + local_1070);
            uVar72 = CONCAT13(in_XMM8_Bd,CONCAT12(in_XMM8_Bc,CONCAT11(in_XMM8_Bb,in_XMM8_Ba))) ^
                     CONCAT13(in_XMM8_Bd,CONCAT12(in_XMM8_Bc,CONCAT11(in_XMM8_Bb,in_XMM8_Ba)));
            in_XMM8_Ba = (undefined1)uVar72;
            in_XMM8_Bb = (undefined1)(uVar72 >> 8);
            in_XMM8_Bc = (undefined1)(uVar72 >> 0x10);
            in_XMM8_Bd = (undefined1)(uVar72 >> 0x18);
            uVar73 = CONCAT13(in_XMM8_Bh,CONCAT12(in_XMM8_Bg,CONCAT11(in_XMM8_Bf,in_XMM8_Be))) ^
                     CONCAT13(in_XMM8_Bh,CONCAT12(in_XMM8_Bg,CONCAT11(in_XMM8_Bf,in_XMM8_Be)));
            in_XMM8_Be = (undefined1)uVar73;
            in_XMM8_Bf = (undefined1)(uVar73 >> 8);
            in_XMM8_Bg = (undefined1)(uVar73 >> 0x10);
            in_XMM8_Bh = (undefined1)(uVar73 >> 0x18);
            auVar120._0_15_ = ZEXT415(uVar71);
            auVar120[0xf] = in_XMM8_Bh;
            auVar119._14_2_ = auVar120._14_2_;
            auVar119._0_13_ = ZEXT413(uVar71);
            auVar119[0xd] = in_XMM8_Bg;
            auVar118._13_3_ = auVar119._13_3_;
            auVar118._0_13_ = ZEXT413(uVar71);
            auVar117._12_4_ = auVar118._12_4_;
            auVar117._4_7_ = 0;
            auVar117._0_4_ = uVar71;
            auVar117[0xb] = in_XMM8_Bf;
            auVar116._11_5_ = auVar117._11_5_;
            auVar116._4_7_ = 0;
            auVar116._0_4_ = uVar71;
            auVar115._10_6_ = auVar116._10_6_;
            auVar115._4_5_ = 0;
            auVar115._0_4_ = uVar71;
            auVar115[9] = in_XMM8_Be;
            auVar114._9_7_ = auVar115._9_7_;
            auVar114._4_5_ = 0;
            auVar114._0_4_ = uVar71;
            Var33 = CONCAT91(CONCAT81(auVar114._8_8_,in_XMM8_Bd),(char)(uVar71 >> 0x18));
            auVar113._6_10_ = Var33;
            auVar113[5] = in_XMM8_Bc;
            auVar113[4] = (char)(uVar71 >> 0x10);
            auVar113._0_4_ = uVar71;
            auVar32._2_12_ = auVar113._4_12_;
            auVar32[1] = in_XMM8_Bb;
            auVar32[0] = (char)(uVar71 >> 8);
            uVar289 = CONCAT11(in_XMM8_Ba,(char)uVar71);
            auVar112._2_14_ = auVar32;
            uVar22 = (undefined2)(uVar73 >> 0x10);
            auVar123._0_12_ = auVar112._0_12_;
            auVar123._12_2_ = (short)Var33;
            auVar123._14_2_ = uVar22;
            auVar122._12_4_ = auVar123._12_4_;
            auVar122._0_10_ = auVar112._0_10_;
            uVar21 = (undefined2)uVar73;
            auVar122._10_2_ = uVar21;
            auVar121._10_6_ = auVar122._10_6_;
            auVar121._0_8_ = auVar112._0_8_;
            auVar121._8_2_ = auVar113._4_2_;
            uVar20 = (undefined2)(uVar72 >> 0x10);
            auVar34._4_8_ = auVar121._8_8_;
            auVar34._2_2_ = uVar20;
            auVar34._0_2_ = auVar32._0_2_;
            uVar106 = (undefined2)uVar72;
            uVar71 = *(uint *)((long)&(This->intersector1).intersect + local_1078);
            auVar150._0_15_ = ZEXT415(uVar71);
            auVar150[0xf] = in_XMM8_Bh;
            auVar149._14_2_ = auVar150._14_2_;
            auVar149._0_13_ = ZEXT413(uVar71);
            auVar149[0xd] = in_XMM8_Bg;
            auVar148._13_3_ = auVar149._13_3_;
            auVar148._0_13_ = ZEXT413(uVar71);
            auVar147._12_4_ = auVar148._12_4_;
            auVar147._4_7_ = 0;
            auVar147._0_4_ = uVar71;
            auVar147[0xb] = in_XMM8_Bf;
            auVar146._11_5_ = auVar147._11_5_;
            auVar146._4_7_ = 0;
            auVar146._0_4_ = uVar71;
            auVar145._10_6_ = auVar146._10_6_;
            auVar145._4_5_ = 0;
            auVar145._0_4_ = uVar71;
            auVar145[9] = in_XMM8_Be;
            auVar144._9_7_ = auVar145._9_7_;
            auVar144._4_5_ = 0;
            auVar144._0_4_ = uVar71;
            Var33 = CONCAT91(CONCAT81(auVar144._8_8_,in_XMM8_Bd),(char)(uVar71 >> 0x18));
            auVar143._6_10_ = Var33;
            auVar143[5] = in_XMM8_Bc;
            auVar143[4] = (char)(uVar71 >> 0x10);
            auVar143._0_4_ = uVar71;
            auVar35._2_12_ = auVar143._4_12_;
            auVar35[1] = in_XMM8_Bb;
            auVar35[0] = (char)(uVar71 >> 8);
            uVar290 = CONCAT11(in_XMM8_Ba,(char)uVar71);
            auVar142._2_14_ = auVar35;
            auVar153._0_12_ = auVar142._0_12_;
            auVar153._12_2_ = (short)Var33;
            auVar153._14_2_ = uVar22;
            auVar152._12_4_ = auVar153._12_4_;
            auVar152._0_10_ = auVar142._0_10_;
            auVar152._10_2_ = uVar21;
            auVar151._10_6_ = auVar152._10_6_;
            auVar151._0_8_ = auVar142._0_8_;
            auVar151._8_2_ = auVar143._4_2_;
            auVar36._4_8_ = auVar151._8_8_;
            auVar36._2_2_ = uVar20;
            auVar36._0_2_ = auVar35._0_2_;
            fVar270 = *(float *)(uVar61 + 0x48 + lVar53);
            uVar71 = *(uint *)((long)&(This->intersector1).intersect + local_1080);
            auVar176._0_15_ = ZEXT415(uVar71);
            auVar176[0xf] = in_XMM8_Bh;
            auVar175._14_2_ = auVar176._14_2_;
            auVar175._0_13_ = ZEXT413(uVar71);
            auVar175[0xd] = in_XMM8_Bg;
            auVar174._13_3_ = auVar175._13_3_;
            auVar174._0_13_ = ZEXT413(uVar71);
            auVar173._12_4_ = auVar174._12_4_;
            auVar173._4_7_ = 0;
            auVar173._0_4_ = uVar71;
            auVar173[0xb] = in_XMM8_Bf;
            auVar172._11_5_ = auVar173._11_5_;
            auVar172._4_7_ = 0;
            auVar172._0_4_ = uVar71;
            auVar171._10_6_ = auVar172._10_6_;
            auVar171._4_5_ = 0;
            auVar171._0_4_ = uVar71;
            auVar171[9] = in_XMM8_Be;
            auVar170._9_7_ = auVar171._9_7_;
            auVar170._4_5_ = 0;
            auVar170._0_4_ = uVar71;
            Var33 = CONCAT91(CONCAT81(auVar170._8_8_,in_XMM8_Bd),(char)(uVar71 >> 0x18));
            auVar169._6_10_ = Var33;
            auVar169[5] = in_XMM8_Bc;
            auVar169[4] = (char)(uVar71 >> 0x10);
            auVar169._0_4_ = uVar71;
            auVar37._2_12_ = auVar169._4_12_;
            auVar37[1] = in_XMM8_Bb;
            auVar37[0] = (char)(uVar71 >> 8);
            uVar291 = CONCAT11(in_XMM8_Ba,(char)uVar71);
            auVar168._2_14_ = auVar37;
            auVar179._0_12_ = auVar168._0_12_;
            auVar179._12_2_ = (short)Var33;
            auVar179._14_2_ = uVar22;
            auVar178._12_4_ = auVar179._12_4_;
            auVar178._0_10_ = auVar168._0_10_;
            auVar178._10_2_ = uVar21;
            auVar177._10_6_ = auVar178._10_6_;
            auVar177._0_8_ = auVar168._0_8_;
            auVar177._8_2_ = auVar169._4_2_;
            auVar38._4_8_ = auVar177._8_8_;
            auVar38._2_2_ = uVar20;
            auVar38._0_2_ = auVar37._0_2_;
            uVar71 = *(uint *)((long)&(This->intersector1).intersect + local_1088);
            auVar188._0_15_ = ZEXT415(uVar71);
            auVar188[0xf] = in_XMM8_Bh;
            auVar187._14_2_ = auVar188._14_2_;
            auVar187._0_13_ = ZEXT413(uVar71);
            auVar187[0xd] = in_XMM8_Bg;
            auVar186._13_3_ = auVar187._13_3_;
            auVar186._0_13_ = ZEXT413(uVar71);
            auVar185._12_4_ = auVar186._12_4_;
            auVar185._4_7_ = 0;
            auVar185._0_4_ = uVar71;
            auVar185[0xb] = in_XMM8_Bf;
            auVar184._11_5_ = auVar185._11_5_;
            auVar184._4_7_ = 0;
            auVar184._0_4_ = uVar71;
            auVar183._10_6_ = auVar184._10_6_;
            auVar183._4_5_ = 0;
            auVar183._0_4_ = uVar71;
            auVar183[9] = in_XMM8_Be;
            auVar182._9_7_ = auVar183._9_7_;
            auVar182._4_5_ = 0;
            auVar182._0_4_ = uVar71;
            Var33 = CONCAT91(CONCAT81(auVar182._8_8_,in_XMM8_Bd),(char)(uVar71 >> 0x18));
            auVar181._6_10_ = Var33;
            auVar181[5] = in_XMM8_Bc;
            auVar181[4] = (char)(uVar71 >> 0x10);
            auVar181._0_4_ = uVar71;
            auVar39._2_12_ = auVar181._4_12_;
            auVar39[1] = in_XMM8_Bb;
            auVar39[0] = (char)(uVar71 >> 8);
            uVar292 = CONCAT11(in_XMM8_Ba,(char)uVar71);
            auVar180._2_14_ = auVar39;
            auVar191._0_12_ = auVar180._0_12_;
            auVar191._12_2_ = (short)Var33;
            auVar191._14_2_ = uVar22;
            auVar190._12_4_ = auVar191._12_4_;
            auVar190._0_10_ = auVar180._0_10_;
            auVar190._10_2_ = uVar21;
            auVar189._10_6_ = auVar190._10_6_;
            auVar189._0_8_ = auVar180._0_8_;
            auVar189._8_2_ = auVar181._4_2_;
            auVar40._4_8_ = auVar189._8_8_;
            auVar40._2_2_ = uVar20;
            auVar40._0_2_ = auVar39._0_2_;
            fVar284 = *(float *)(uVar61 + 0x4c + lVar53);
            uVar71 = *(uint *)((long)&(This->intersector1).intersect + local_1090);
            auVar214._0_15_ = ZEXT415(uVar71);
            auVar214[0xf] = in_XMM8_Bh;
            auVar213._14_2_ = auVar214._14_2_;
            auVar213._0_13_ = ZEXT413(uVar71);
            auVar213[0xd] = in_XMM8_Bg;
            auVar212._13_3_ = auVar213._13_3_;
            auVar212._0_13_ = ZEXT413(uVar71);
            auVar211._12_4_ = auVar212._12_4_;
            auVar211._4_7_ = 0;
            auVar211._0_4_ = uVar71;
            auVar211[0xb] = in_XMM8_Bf;
            auVar210._11_5_ = auVar211._11_5_;
            auVar210._4_7_ = 0;
            auVar210._0_4_ = uVar71;
            auVar209._10_6_ = auVar210._10_6_;
            auVar209._4_5_ = 0;
            auVar209._0_4_ = uVar71;
            auVar209[9] = in_XMM8_Be;
            auVar208._9_7_ = auVar209._9_7_;
            auVar208._4_5_ = 0;
            auVar208._0_4_ = uVar71;
            Var33 = CONCAT91(CONCAT81(auVar208._8_8_,in_XMM8_Bd),(char)(uVar71 >> 0x18));
            auVar207._6_10_ = Var33;
            auVar207[5] = in_XMM8_Bc;
            auVar207[4] = (char)(uVar71 >> 0x10);
            auVar207._0_4_ = uVar71;
            auVar41._2_12_ = auVar207._4_12_;
            auVar41[1] = in_XMM8_Bb;
            auVar41[0] = (char)(uVar71 >> 8);
            uVar293 = CONCAT11(in_XMM8_Ba,(char)uVar71);
            auVar206._2_14_ = auVar41;
            auVar217._0_12_ = auVar206._0_12_;
            auVar217._12_2_ = (short)Var33;
            auVar217._14_2_ = uVar22;
            auVar216._12_4_ = auVar217._12_4_;
            auVar216._0_10_ = auVar206._0_10_;
            auVar216._10_2_ = uVar21;
            auVar215._10_6_ = auVar216._10_6_;
            auVar215._0_8_ = auVar206._0_8_;
            auVar215._8_2_ = auVar207._4_2_;
            auVar42._4_8_ = auVar215._8_8_;
            auVar42._2_2_ = uVar20;
            auVar42._0_2_ = auVar41._0_2_;
            local_1050 = This;
            uVar71 = *(uint *)((long)&(This->intersector1).intersect + local_1098);
            auVar230._0_15_ = ZEXT415(uVar71);
            auVar230[0xf] = in_XMM8_Bh;
            auVar229._14_2_ = auVar230._14_2_;
            auVar229._0_13_ = ZEXT413(uVar71);
            auVar229[0xd] = in_XMM8_Bg;
            auVar228._13_3_ = auVar229._13_3_;
            auVar228._0_13_ = ZEXT413(uVar71);
            auVar227._12_4_ = auVar228._12_4_;
            auVar227._4_7_ = 0;
            auVar227._0_4_ = uVar71;
            auVar227[0xb] = in_XMM8_Bf;
            auVar226._11_5_ = auVar227._11_5_;
            auVar226._4_7_ = 0;
            auVar226._0_4_ = uVar71;
            auVar225._10_6_ = auVar226._10_6_;
            auVar225._4_5_ = 0;
            auVar225._0_4_ = uVar71;
            auVar225[9] = in_XMM8_Be;
            auVar224._9_7_ = auVar225._9_7_;
            auVar224._4_5_ = 0;
            auVar224._0_4_ = uVar71;
            Var33 = CONCAT91(CONCAT81(auVar224._8_8_,in_XMM8_Bd),(char)(uVar71 >> 0x18));
            auVar223._6_10_ = Var33;
            auVar223[5] = in_XMM8_Bc;
            auVar223[4] = (char)(uVar71 >> 0x10);
            auVar223._0_4_ = uVar71;
            auVar43._2_12_ = auVar223._4_12_;
            auVar43[1] = in_XMM8_Bb;
            auVar43[0] = (char)(uVar71 >> 8);
            uVar294 = CONCAT11(in_XMM8_Ba,(char)uVar71);
            auVar222._2_14_ = auVar43;
            auVar233._0_12_ = auVar222._0_12_;
            auVar233._12_2_ = (short)Var33;
            auVar233._14_2_ = uVar22;
            auVar232._12_4_ = auVar233._12_4_;
            auVar232._0_10_ = auVar222._0_10_;
            auVar232._10_2_ = uVar21;
            auVar231._10_6_ = auVar232._10_6_;
            auVar231._0_8_ = auVar222._0_8_;
            auVar231._8_2_ = auVar223._4_2_;
            auVar44._4_8_ = auVar231._8_8_;
            auVar44._2_2_ = uVar20;
            auVar44._0_2_ = auVar43._0_2_;
            fVar197 = *(float *)(uVar61 + 0x40 + lVar53);
            auVar124._0_4_ =
                 (((float)CONCAT22(uVar106,uVar289) * fVar268 + fVar286) - local_11c8) * fVar238;
            auVar124._4_4_ = (((float)auVar34._0_4_ * fVar268 + fVar286) - fStack_11c4) * fVar239;
            auVar124._8_4_ = (((float)auVar121._8_4_ * fVar268 + fVar286) - fStack_11c0) * fVar241;
            auVar124._12_4_ = (((float)auVar122._12_4_ * fVar268 + fVar286) - fStack_11bc) * fVar247
            ;
            auVar200._0_4_ =
                 (((float)CONCAT22(uVar106,uVar291) * fVar270 + fVar203) - fVar220) * fVar244;
            auVar200._4_4_ = (((float)auVar38._0_4_ * fVar270 + fVar203) - fVar221) * fVar245;
            auVar200._8_4_ = (((float)auVar177._8_4_ * fVar270 + fVar203) - fVar235) * fVar246;
            auVar200._12_4_ = (((float)auVar178._12_4_ * fVar270 + fVar203) - fVar136) * fVar248;
            auVar108 = maxps(auVar124,auVar200);
            auVar154._0_4_ =
                 (((float)CONCAT22(uVar106,uVar290) * fVar268 + fVar286) - local_11c8) * fVar238;
            auVar154._4_4_ = (((float)auVar36._0_4_ * fVar268 + fVar286) - fStack_11c4) * fVar239;
            auVar154._8_4_ = (((float)auVar151._8_4_ * fVar268 + fVar286) - fStack_11c0) * fVar241;
            auVar154._12_4_ = (((float)auVar152._12_4_ * fVar268 + fVar286) - fStack_11bc) * fVar247
            ;
            auVar192._0_4_ =
                 (((float)CONCAT22(uVar106,uVar292) * fVar270 + fVar203) - fVar220) * fVar244;
            auVar192._4_4_ = (((float)auVar40._0_4_ * fVar270 + fVar203) - fVar221) * fVar245;
            auVar192._8_4_ = (((float)auVar189._8_4_ * fVar270 + fVar203) - fVar235) * fVar246;
            auVar192._12_4_ = (((float)auVar190._12_4_ * fVar270 + fVar203) - fVar136) * fVar248;
            auVar80 = minps(auVar154,auVar192);
            auVar218._0_4_ =
                 (((float)CONCAT22(uVar106,uVar293) * fVar284 + fVar197) - local_10b8) * fVar160;
            auVar218._4_4_ = (((float)auVar42._0_4_ * fVar284 + fVar197) - fStack_10b4) * fVar161;
            auVar218._8_4_ = (((float)auVar215._8_4_ * fVar284 + fVar197) - fStack_10b0) * fVar162;
            auVar218._12_4_ = (((float)auVar216._12_4_ * fVar284 + fVar197) - fStack_10ac) * fVar250
            ;
            auVar137 = maxps(auVar218,local_1048);
            local_f88 = maxps(auVar108,auVar137);
            auVar234._0_4_ =
                 (((float)CONCAT22(uVar106,uVar294) * fVar284 + fVar197) - local_10b8) * fVar160;
            auVar234._4_4_ = (((float)auVar44._0_4_ * fVar284 + fVar197) - fStack_10b4) * fVar161;
            auVar234._8_4_ = (((float)auVar231._8_4_ * fVar284 + fVar197) - fStack_10b0) * fVar162;
            auVar234._12_4_ = (((float)auVar232._12_4_ * fVar284 + fVar197) - fStack_10ac) * fVar250
            ;
            auVar108 = minps(auVar234,auVar242);
            auVar108 = minps(auVar80,auVar108);
            auVar90[0xe] = bVar107;
            auVar90[0xf] = bVar107;
            auVar89._14_2_ = auVar90._14_2_;
            auVar89[0xd] = cVar105;
            auVar89._0_13_ = auVar79;
            auVar88._13_3_ = auVar89._13_3_;
            auVar88[0xc] = cVar105;
            auVar88._0_12_ = auVar78;
            auVar87._12_4_ = auVar88._12_4_;
            auVar87[0xb] = cVar104;
            auVar87._0_11_ = auVar77;
            auVar86._11_5_ = auVar87._11_5_;
            auVar86[10] = cVar104;
            auVar86._0_10_ = auVar77._0_10_;
            auVar85._10_6_ = auVar86._10_6_;
            auVar85[9] = cVar103;
            Var33 = CONCAT91(CONCAT81((long)(CONCAT72(auVar85._9_7_,CONCAT11(cVar103,bVar107)) >> 8)
                                      ,cVar102),cVar102);
            auVar46._2_10_ = Var33;
            auVar46[1] = cVar101;
            auVar46[0] = cVar101;
            auVar45._2_12_ = auVar46;
            auVar45[1] = cVar99;
            auVar45[0] = cVar99;
            auVar84._0_2_ = CONCAT11(cVar76,cVar76);
            auVar84._2_14_ = auVar45;
            uVar106 = (undefined2)Var33;
            auVar93._0_12_ = auVar84._0_12_;
            auVar93._12_2_ = uVar106;
            auVar93._14_2_ = uVar106;
            auVar92._12_4_ = auVar93._12_4_;
            auVar92._0_10_ = auVar84._0_10_;
            auVar92._10_2_ = auVar46._0_2_;
            auVar91._10_6_ = auVar92._10_6_;
            auVar91._0_8_ = auVar84._0_8_;
            auVar91._8_2_ = auVar46._0_2_;
            auVar47._4_8_ = auVar91._8_8_;
            auVar47._2_2_ = auVar45._0_2_;
            auVar47._0_2_ = auVar45._0_2_;
            uVar71 = CONCAT22(auVar84._0_2_,auVar84._0_2_);
            auVar125._0_4_ = -(uint)(local_f88._0_4_ <= auVar108._0_4_) & uVar71;
            auVar125._4_4_ = -(uint)(local_f88._4_4_ <= auVar108._4_4_) & auVar47._0_4_;
            auVar125._8_4_ = -(uint)(local_f88._8_4_ <= auVar108._8_4_) & auVar91._8_4_;
            auVar125._12_4_ = -(uint)(local_f88._12_4_ <= auVar108._12_4_) & auVar92._12_4_;
            uVar71 = movmskps((int)lVar53,auVar125);
            if (uVar71 != 0) {
              uVar57 = (ulong)(uVar71 & 0xff);
              do {
                auVar108 = _local_1308;
                This = (Intersectors *)0x0;
                if (uVar57 != 0) {
                  for (; (uVar57 >> (long)This & 1) == 0;
                      This = (Intersectors *)((long)&((RefCount *)&This->ptr)->_vptr_RefCount + 1))
                  {
                  }
                }
                fVar286 = *(float *)&(((Intersectors *)ray)->intersector1).intersect;
                if (*(float *)(local_f88 + (long)This * 4) <= fVar286) {
                  local_fb8 = ZEXT416((uint)fVar286);
                  uVar71 = *(uint *)((long)&((RefCount *)&local_1050->ptr)->_vptr_RefCount +
                                    (long)This * 8 + 4);
                  pSVar54 = *(Scene **)(((RTCRayHit4 *)context)->ray).org_x;
                  pGVar10 = (pSVar54->geometries).items[*(uint *)&(local_1050->intersector4).name].
                            ptr;
                  local_11d0 = *(long *)&pGVar10->field_0x58;
                  lVar11 = *(long *)&pGVar10[1].time_range.upper;
                  local_12a8 = (ulong)uVar71;
                  lVar69 = (ulong)uVar71 *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i;
                  pSVar12 = (Scene *)(&((RefCount *)&local_1050->ptr)->_vptr_RefCount)[(long)This];
                  auVar94._8_8_ = 0;
                  auVar94._0_8_ = pSVar12;
                  auVar94 = auVar94 & _DAT_01fab9a0;
                  auVar29._10_2_ = 0;
                  auVar29._0_10_ = auVar94._0_10_;
                  auVar29._12_2_ = auVar94._6_2_;
                  auVar30._8_2_ = auVar94._4_2_;
                  auVar30._0_8_ = auVar94._0_8_;
                  auVar30._10_4_ = auVar29._10_4_;
                  auVar48._6_8_ = 0;
                  auVar48._0_6_ = auVar30._8_6_;
                  auVar31._4_2_ = auVar94._2_2_;
                  auVar31._0_4_ = auVar94._0_4_;
                  auVar31._6_8_ = SUB148(auVar48 << 0x40,6);
                  local_1038._0_4_ = CONCAT22(0,auVar94._0_2_);
                  local_1038._4_10_ = auVar31._4_10_;
                  local_1038._14_2_ = 0;
                  uVar68 = *(ulong *)(local_11d0 + lVar69);
                  uVar70 = (ulong)(uint)((int)((ulong)(auVar94._0_4_ >> 0x10) * (uVar68 >> 0x20)) +
                                        (int)uVar68 + local_1038._0_4_);
                  p_Var13 = pGVar10[1].intersectionFilterN;
                  pfVar2 = (float *)(lVar11 + (long)p_Var13 * uVar70);
                  fVar203 = *pfVar2;
                  fVar136 = pfVar2[1];
                  fVar268 = pfVar2[2];
                  pfVar2 = (float *)(lVar11 + (uVar70 + 1) * (long)p_Var13);
                  local_1308._0_4_ = *pfVar2;
                  local_f98 = pfVar2[1];
                  fVar270 = pfVar2[2];
                  This = (Intersectors *)(uVar68 >> 0x20);
                  lVar53 = (long)&((RefCount *)&This->ptr)->_vptr_RefCount + uVar70;
                  lVar63 = (long)&((RefCount *)&This->ptr)->_vptr_RefCount + uVar70 + 1;
                  pfVar2 = (float *)(lVar11 + lVar53 * (long)p_Var13);
                  fVar284 = *pfVar2;
                  local_1278 = pfVar2[1];
                  local_1268 = pfVar2[2];
                  pfVar2 = (float *)(lVar11 + lVar63 * (long)p_Var13);
                  local_12c8._0_4_ = *pfVar2;
                  local_12b8._0_4_ = pfVar2[1];
                  local_12e8._0_4_ = pfVar2[2];
                  uVar68 = (ulong)(-1 < (short)pSVar12);
                  pfVar2 = (float *)(lVar11 + (uVar70 + uVar68 + 1) * (long)p_Var13);
                  local_1308._4_4_ = *pfVar2;
                  lVar66 = uVar68 + lVar63;
                  pfVar3 = (float *)(lVar11 + lVar66 * (long)p_Var13);
                  local_12c8._4_4_ = *pfVar3;
                  local_12b8._4_4_ = pfVar3[1];
                  local_12e8._4_4_ = pfVar3[2];
                  pIVar60 = (Intersectors *)0x0;
                  if (-1 < (short)((ulong)pSVar12 >> 0x10)) {
                    pIVar60 = This;
                  }
                  pfVar3 = (float *)(lVar11 + ((long)&((RefCount *)&pIVar60->ptr)->_vptr_RefCount +
                                              lVar53) * (long)p_Var13);
                  fStack_126c = pfVar3[1];
                  fStack_125c = pfVar3[2];
                  pfVar4 = (float *)(lVar11 + ((long)&((RefCount *)&pIVar60->ptr)->_vptr_RefCount +
                                              lVar63) * (long)p_Var13);
                  fStack_12ac = pfVar4[1];
                  fStack_1260 = pfVar4[2];
                  lVar53 = lVar11 + ((long)&((RefCount *)&pIVar60->ptr)->_vptr_RefCount + lVar66) *
                                    (long)p_Var13;
                  fStack_12b0 = *(float *)(lVar53 + 4);
                  _fStack_1300 = auVar108._8_8_;
                  auVar242 = _local_1308;
                  local_12f8 = (Intersectors *)CONCAT44((float)local_12c8,local_12c8._4_4_);
                  uStack_12d8 = *(undefined4 *)(lVar53 + 8);
                  fStack_12d4 = fStack_1260;
                  fStack_f94 = pfVar2[1];
                  fStack_f90 = local_12b8._4_4_;
                  fStack_f8c = (float)local_12b8;
                  fVar275 = fVar136 - local_f98;
                  fVar277 = local_f98 - pfVar2[1];
                  fVar279 = (float)local_12b8 - local_12b8._4_4_;
                  fVar281 = local_1278 - (float)local_12b8;
                  auVar49._4_8_ = uStack_1180;
                  auVar49._0_4_ = pfVar2[2];
                  local_1188 = (undefined1  [8])(auVar49._0_8_ << 0x20);
                  uStack_1180._0_4_ = local_12e8._4_4_;
                  uStack_1180._4_4_ = (float)local_12e8;
                  fVar254 = fVar268 - fVar270;
                  fVar255 = fVar270 - pfVar2[2];
                  fVar256 = (float)local_12e8 - local_12e8._4_4_;
                  fVar258 = local_1268 - (float)local_12e8;
                  fStack_1274 = (float)local_12b8;
                  fStack_1270 = fStack_12ac;
                  fVar260 = local_1278 - fVar136;
                  fVar262 = (float)local_12b8 - local_f98;
                  fVar264 = fStack_12ac - (float)local_12b8;
                  fVar266 = fStack_126c - local_1278;
                  fStack_1264 = (float)local_12e8;
                  fVar283 = local_1268 - fVar268;
                  fVar285 = (float)local_12e8 - fVar270;
                  fVar287 = fStack_1260 - (float)local_12e8;
                  fVar288 = fStack_125c - local_1268;
                  local_10e8._0_4_ = fVar254 * fVar260 - fVar275 * fVar283;
                  local_10e8._4_4_ = fVar255 * fVar262 - fVar277 * fVar285;
                  fStack_11b0 = fVar256 * fVar264 - fVar279 * fVar287;
                  fStack_11ac = fVar258 * fVar266 - fVar281 * fVar288;
                  local_11b8 = (RTCIntersectArguments *)CONCAT44(local_10e8._4_4_,local_10e8._0_4_);
                  local_1198 = CONCAT44((float)local_12c8,fVar284);
                  local_1188._4_4_ = *pfVar3;
                  local_1188._0_4_ = *pfVar4;
                  fVar247 = fVar284 - fVar203;
                  fVar244 = (float)local_12c8 - (float)local_1308._0_4_;
                  fVar245 = *pfVar4 - (float)local_12c8;
                  fVar246 = *pfVar3 - fVar284;
                  local_1298._0_4_ = (((RayK<1> *)&local_12f0->ptr)->org).field_0.m128[0];
                  local_1028 = (((RayK<1> *)&local_12f0->ptr)->org).field_0.m128[1];
                  local_1288 = *(float *)&local_12f0->leafIntersector;
                  local_11a8._0_4_ =
                       ((anon_union_16_2_47237d3f_for_Vec3fx_0 *)&(local_12f0->collider).collide)->
                       m128[0];
                  fVar240 = ((anon_union_16_2_47237d3f_for_Vec3fx_0 *)
                            &(local_12f0->collider).collide)->m128[1];
                  local_11e8._4_4_ = *(undefined4 *)&(local_12f0->collider).name;
                  local_1298._4_4_ = (float)local_1298;
                  fStack_1290 = (float)local_1298;
                  fStack_128c = (float)local_1298;
                  fVar197 = fVar203 - (float)local_1298;
                  fVar237 = (float)local_1308._0_4_ - (float)local_1298;
                  fVar241 = (float)local_12c8 - (float)local_1298;
                  local_1298._0_4_ = fVar284 - (float)local_1298;
                  fStack_1024 = local_1028;
                  fStack_1020 = local_1028;
                  fStack_101c = local_1028;
                  fVar136 = fVar136 - local_1028;
                  fVar160 = local_f98 - local_1028;
                  fVar161 = (float)local_12b8 - local_1028;
                  fVar162 = local_1278 - local_1028;
                  fVar248 = fVar197 * fVar240 - fVar136 * (float)local_11a8;
                  fVar249 = fVar237 * fVar240 - fVar160 * (float)local_11a8;
                  fVar251 = fVar241 * fVar240 - fVar161 * (float)local_11a8;
                  fVar252 = (float)local_1298 * fVar240 - fVar162 * (float)local_11a8;
                  fStack_1300 = auVar108._8_4_;
                  fStack_12fc = auVar108._12_4_;
                  fVar203 = fVar203 - (float)local_1308._0_4_;
                  fVar250 = (float)local_1308._0_4_ - (float)local_1308._4_4_;
                  fVar220 = (float)local_12c8 - fStack_1300;
                  fVar221 = fVar284 - fStack_12fc;
                  local_10d8[0] = fVar203 * fVar283 - fVar254 * fVar247;
                  local_10d8[1] = fVar250 * fVar285 - fVar255 * fVar244;
                  local_10d8[2] = fVar220 * fVar287 - fVar256 * fVar245;
                  local_10d8[3] = fVar221 * fVar288 - fVar258 * fVar246;
                  fStack_1284 = local_1288;
                  fStack_1280 = local_1288;
                  fStack_127c = local_1288;
                  fVar268 = fVar268 - local_1288;
                  fVar270 = fVar270 - local_1288;
                  fVar272 = (float)local_12e8 - local_1288;
                  local_1288 = local_1268 - local_1288;
                  uVar5 = CONCAT17((char)((uint)fVar237 >> 0x18),
                                   CONCAT16((char)((uint)fVar237 >> 0x10),
                                            CONCAT15((char)((uint)fVar237 >> 8),
                                                     CONCAT14(SUB41(fVar237,0),fVar197))));
                  local_fc8._8_4_ = fVar241;
                  local_fc8._0_8_ = uVar5;
                  local_fc8._12_4_ = (float)local_1298;
                  fVar235 = fVar268 * (float)local_11a8 - fVar197 * (float)local_11e8._4_4_;
                  fVar237 = fVar270 * (float)local_11a8 - fVar237 * (float)local_11e8._4_4_;
                  fVar238 = fVar272 * (float)local_11a8 - fVar241 * (float)local_11e8._4_4_;
                  fVar239 = local_1288 * (float)local_11a8 -
                            (float)local_1298 * (float)local_11e8._4_4_;
                  local_10c8[0] = fVar275 * fVar247 - fVar203 * fVar260;
                  local_10c8[1] = fVar277 * fVar244 - fVar250 * fVar262;
                  fVar257 = fVar279 * fVar245 - fVar220 * fVar264;
                  fVar259 = fVar281 * fVar246 - fVar221 * fVar266;
                  fVar276 = fVar136 * (float)local_11e8._4_4_ - fVar268 * fVar240;
                  fVar278 = fVar160 * (float)local_11e8._4_4_ - fVar270 * fVar240;
                  fVar280 = fVar161 * (float)local_11e8._4_4_ - fVar272 * fVar240;
                  fVar282 = fVar162 * (float)local_11e8._4_4_ - local_1288 * fVar240;
                  local_11e8._0_4_ = local_11e8._4_4_;
                  fStack_11e0 = (float)local_11e8._4_4_;
                  fStack_11dc = (float)local_11e8._4_4_;
                  local_11a8._4_4_ = (float)local_11a8;
                  fStack_11a0 = (float)local_11a8;
                  fStack_119c = (float)local_11a8;
                  fVar269 = (float)local_10e8._0_4_ * (float)local_11a8 +
                            local_10d8[0] * fVar240 + local_10c8[0] * (float)local_11e8._4_4_;
                  fVar271 = (float)local_10e8._4_4_ * (float)local_11a8 +
                            local_10d8[1] * fVar240 + local_10c8[1] * (float)local_11e8._4_4_;
                  fVar273 = fStack_11b0 * (float)local_11a8 +
                            local_10d8[2] * fVar240 + fVar257 * (float)local_11e8._4_4_;
                  fVar274 = fStack_11ac * (float)local_11a8 +
                            local_10d8[3] * fVar240 + fVar259 * (float)local_11e8._4_4_;
                  uVar261 = (uint)fVar269 & 0x80000000;
                  uVar263 = (uint)fVar271 & 0x80000000;
                  uVar265 = (uint)fVar273 & 0x80000000;
                  uVar267 = (uint)fVar274 & 0x80000000;
                  fVar247 = (float)((uint)(fVar247 * fVar276 + fVar260 * fVar235 + fVar283 * fVar248
                                          ) ^ uVar261);
                  fVar244 = (float)((uint)(fVar244 * fVar278 + fVar262 * fVar237 + fVar285 * fVar249
                                          ) ^ uVar263);
                  fVar245 = (float)((uint)(fVar245 * fVar280 + fVar264 * fVar238 + fVar287 * fVar251
                                          ) ^ uVar265);
                  fVar246 = (float)((uint)(fVar246 * fVar282 + fVar266 * fVar239 + fVar288 * fVar252
                                          ) ^ uVar267);
                  fVar203 = (float)((uint)(fVar276 * fVar203 + fVar235 * fVar275 + fVar248 * fVar254
                                          ) ^ uVar261);
                  fVar237 = (float)((uint)(fVar278 * fVar250 + fVar237 * fVar277 + fVar249 * fVar255
                                          ) ^ uVar263);
                  fVar250 = (float)((uint)(fVar280 * fVar220 + fVar238 * fVar279 + fVar251 * fVar256
                                          ) ^ uVar265);
                  fVar220 = (float)((uint)(fVar282 * fVar221 + fVar239 * fVar281 + fVar252 * fVar258
                                          ) ^ uVar267);
                  local_1148._0_4_ = ABS(fVar269);
                  local_1148._4_4_ = ABS(fVar271);
                  fStack_1140 = ABS(fVar273);
                  fStack_113c = ABS(fVar274);
                  uVar72 = -(uint)((0.0 <= fVar203 && 0.0 <= fVar247) && fVar269 != 0.0) &
                           local_1018 & -(uint)(fVar247 + fVar203 <= (float)local_1148._0_4_);
                  uVar73 = -(uint)((0.0 <= fVar237 && 0.0 <= fVar244) && fVar271 != 0.0) &
                           uStack_1014 & -(uint)(fVar244 + fVar237 <= (float)local_1148._4_4_);
                  uVar74 = -(uint)((0.0 <= fVar250 && 0.0 <= fVar245) && fVar273 != 0.0) &
                           uStack_1010 & -(uint)(fVar245 + fVar250 <= fStack_1140);
                  uVar253 = -(uint)((0.0 <= fVar220 && 0.0 <= fVar246) && fVar274 != 0.0) &
                            uStack_100c & -(uint)(fVar246 + fVar220 <= fStack_113c);
                  auVar23._4_4_ = uVar73;
                  auVar23._0_4_ = uVar72;
                  auVar23._8_4_ = uVar74;
                  auVar23._12_4_ = uVar253;
                  iVar56 = movmskps((int)lVar11,auVar23);
                  ray = (RayHit *)local_12f0;
                  if (iVar56 == 0) {
LAB_00d25434:
                    uVar71 = (uint)pSVar54;
                    fVar286 = (float)local_12c8;
                  }
                  else {
                    local_fc8._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
                    local_1158 = (float)(uVar261 ^
                                        (uint)(fVar197 * (float)local_10e8._0_4_ +
                                              fVar136 * local_10d8[0] + fVar268 * local_10c8[0]));
                    fStack_1154 = (float)(uVar263 ^
                                         (uint)((float)local_fc8._4_4_ * (float)local_10e8._4_4_ +
                                               fVar160 * local_10d8[1] + fVar270 * local_10c8[1]));
                    fStack_1150 = (float)(uVar265 ^
                                         (uint)(fVar241 * fStack_11b0 +
                                               fVar161 * local_10d8[2] + fVar272 * fVar257));
                    fStack_114c = (float)(uVar267 ^
                                         (uint)((float)local_1298 * fStack_11ac +
                                               fVar162 * local_10d8[3] + local_1288 * fVar259));
                    fVar136 = *(float *)((long)&local_12f0->leafIntersector + 4);
                    auVar236._0_4_ =
                         -(uint)(fVar136 * (float)local_1148._0_4_ < local_1158 &&
                                local_1158 <= fVar286 * (float)local_1148._0_4_) & uVar72;
                    auVar236._4_4_ =
                         -(uint)(fVar136 * (float)local_1148._4_4_ < fStack_1154 &&
                                fStack_1154 <= fVar286 * (float)local_1148._4_4_) & uVar73;
                    auVar236._8_4_ =
                         -(uint)(fVar136 * fStack_1140 < fStack_1150 &&
                                fStack_1150 <= fVar286 * fStack_1140) & uVar74;
                    auVar236._12_4_ =
                         -(uint)(fVar136 * fStack_113c < fStack_114c &&
                                fStack_114c <= fVar286 * fStack_113c) & uVar253;
                    iVar56 = movmskps(iVar56,auVar236);
                    if (iVar56 == 0) goto LAB_00d25434;
                    local_1128 = auVar236;
                    fStack_10e0 = fStack_11b0;
                    fStack_10dc = fStack_11ac;
                    uStack_10c0 = CONCAT44(fVar259,fVar257);
                    local_1038._4_4_ = auVar31._4_4_;
                    fVar286 = (float)(int)(*(ushort *)(local_11d0 + 8 + lVar69) - 1);
                    auVar108 = rcpss(ZEXT416((uint)fVar286),ZEXT416((uint)fVar286));
                    fVar136 = (float)(int)(*(ushort *)(local_11d0 + 10 + lVar69) - 1);
                    fStack_116c = (2.0 - fVar286 * auVar108._0_4_) * auVar108._0_4_;
                    auVar108 = rcpss(ZEXT416((uint)fVar136),ZEXT416((uint)fVar136));
                    fVar286 = (2.0 - fVar136 * auVar108._0_4_) * auVar108._0_4_;
                    local_1178._0_4_ =
                         fStack_116c * ((float)local_1038._0_4_ * (float)local_1148._0_4_ + fVar247)
                    ;
                    local_1178._4_4_ =
                         fStack_116c *
                         ((float)(local_1038._0_4_ + 1) * (float)local_1148._4_4_ + fVar244);
                    fStack_1170 = fStack_116c *
                                  ((float)(local_1038._0_4_ + 1) * fStack_1140 + fVar245);
                    fStack_116c = fStack_116c * ((float)local_1038._0_4_ * fStack_113c + fVar246);
                    auVar156._0_4_ = (float)local_1038._4_4_ * (float)local_1148._0_4_ + fVar203;
                    auVar156._4_4_ = (float)local_1038._4_4_ * (float)local_1148._4_4_ + fVar237;
                    auVar156._8_4_ = (float)(local_1038._4_4_ + 1) * fStack_1140 + fVar250;
                    auVar156._12_4_ = (float)(local_1038._4_4_ + 1) * fStack_113c + fVar220;
                    local_1168._4_4_ = fVar286 * auVar156._4_4_;
                    local_1168._0_4_ = fVar286 * auVar156._0_4_;
                    fStack_1160 = fVar286 * auVar156._8_4_;
                    fStack_115c = fVar286 * auVar156._12_4_;
                    This = (Intersectors *)(pSVar54->geometries).items[(long)local_12f8].ptr;
                    uVar72 = *(int *)((long)&(local_12f0->intersector1).intersect + 4);
                    pSVar54 = (Scene *)(ulong)uVar72;
                    if ((*(uint *)((long)&(This->intersector1).pointQuery + 4) & uVar72) == 0)
                    goto LAB_00d25434;
                    local_1258 = auVar236;
                    auVar27._4_4_ = local_1148._4_4_;
                    auVar27._0_4_ = local_1148._0_4_;
                    auVar27._8_4_ = fStack_1140;
                    auVar27._12_4_ = fStack_113c;
                    auVar108 = rcpps(auVar156,auVar27);
                    fVar284 = auVar108._0_4_;
                    fVar197 = auVar108._4_4_;
                    fVar237 = auVar108._8_4_;
                    fVar160 = auVar108._12_4_;
                    fVar284 = (1.0 - (float)local_1148._0_4_ * fVar284) * fVar284 + fVar284;
                    fVar197 = (1.0 - (float)local_1148._4_4_ * fVar197) * fVar197 + fVar197;
                    fVar237 = (1.0 - fStack_1140 * fVar237) * fVar237 + fVar237;
                    fVar160 = (1.0 - fStack_113c * fVar160) * fVar160 + fVar160;
                    fVar203 = local_1158 * fVar284;
                    fVar136 = fStack_1154 * fVar197;
                    fVar268 = fStack_1150 * fVar237;
                    fVar270 = fStack_114c * fVar160;
                    local_10f8[0] = fVar203;
                    local_10f8[1] = fVar136;
                    local_10f8[2] = fVar268;
                    local_10f8[3] = fVar270;
                    local_1118[0] = (float)local_1178._0_4_ * fVar284;
                    local_1118[1] = (float)local_1178._4_4_ * fVar197;
                    local_1118[2] = fStack_1170 * fVar237;
                    local_1118[3] = fStack_116c * fVar160;
                    local_1108[0] = fVar286 * auVar156._0_4_ * fVar284;
                    local_1108[1] = fVar286 * auVar156._4_4_ * fVar197;
                    local_1108[2] = fVar286 * auVar156._8_4_ * fVar237;
                    local_1108[3] = fVar286 * auVar156._12_4_ * fVar160;
                    auVar157._0_8_ = CONCAT44(~auVar236._4_4_,~auVar236._0_4_) & 0x7f8000007f800000;
                    auVar157._8_4_ = ~auVar236._8_4_ & 0x7f800000;
                    auVar157._12_4_ = ~auVar236._12_4_ & 0x7f800000;
                    auVar26._4_4_ = (uint)fVar136 & auVar236._4_4_;
                    auVar26._0_4_ = (uint)fVar203 & auVar236._0_4_;
                    auVar26._8_4_ = (uint)fVar268 & auVar236._8_4_;
                    auVar26._12_4_ = (uint)fVar270 & auVar236._12_4_;
                    auVar157 = auVar157 | auVar26;
                    auVar194._4_4_ = auVar157._0_4_;
                    auVar194._0_4_ = auVar157._4_4_;
                    auVar194._8_4_ = auVar157._12_4_;
                    auVar194._12_4_ = auVar157._8_4_;
                    auVar108 = minps(auVar194,auVar157);
                    auVar128._0_8_ = auVar108._8_8_;
                    auVar128._8_4_ = auVar108._0_4_;
                    auVar128._12_4_ = auVar108._4_4_;
                    auVar108 = minps(auVar128,auVar108);
                    auVar129._0_8_ =
                         CONCAT44(-(uint)(auVar108._4_4_ == auVar157._4_4_) & auVar236._4_4_,
                                  -(uint)(auVar108._0_4_ == auVar157._0_4_) & auVar236._0_4_);
                    auVar129._8_4_ = -(uint)(auVar108._8_4_ == auVar157._8_4_) & auVar236._8_4_;
                    auVar129._12_4_ = -(uint)(auVar108._12_4_ == auVar157._12_4_) & auVar236._12_4_;
                    iVar56 = movmskps(uVar72,auVar129);
                    if (iVar56 != 0) {
                      auVar236._8_4_ = auVar129._8_4_;
                      auVar236._0_8_ = auVar129._0_8_;
                      auVar236._12_4_ = auVar129._12_4_;
                    }
                    uVar72 = movmskps(iVar56,auVar236);
                    lVar53 = 0;
                    if (uVar72 != 0) {
                      for (; (uVar72 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                      }
                    }
                    local_11b8 = *(RTCIntersectArguments **)(local_12d0->ray).org_y;
                    if ((local_11b8->filter == (RTCFilterFunctionN)0x0) &&
                       ((This->intersector4).intersect == (IntersectFunc4)0x0)) {
                      fVar286 = local_1118[lVar53];
                      fVar203 = local_1108[lVar53];
                      uVar51 = *(undefined4 *)(local_10e8 + lVar53 * 4);
                      fVar136 = local_10d8[lVar53];
                      fVar268 = local_10c8[lVar53];
                      *(float *)&(local_12f0->intersector1).intersect = local_10f8[lVar53];
                      *(undefined4 *)&(local_12f0->intersector1).pointQuery = uVar51;
                      *(float *)((long)&(local_12f0->intersector1).pointQuery + 4) = fVar136;
                      *(float *)&(local_12f0->intersector1).name = fVar268;
                      *(float *)((long)&(local_12f0->intersector1).name + 4) = fVar286;
                      *(float *)&(local_12f0->intersector4).intersect = fVar203;
                      *(uint *)((long)&(local_12f0->intersector4).intersect + 4) = uVar71;
                      *(float *)&(local_12f0->intersector4).occluded = local_12c8._4_4_;
                      pRVar14 = *(RTCRayQueryContext **)((long)(local_12d0->ray).org_x + 8);
                      *(uint *)((long)&(local_12f0->intersector4).occluded + 4) = pRVar14->instID[0]
                      ;
                      uVar71 = pRVar14->instPrimID[0];
                      *(uint *)&(local_12f0->intersector4).name = uVar71;
                    }
                    else {
                      local_11a8 = *(RayQueryContext **)((long)(local_12d0->ray).org_x + 8);
                      _local_11e8 = ZEXT416((uint)*(float *)&(local_12f0->intersector1).intersect);
                      local_1298 = This;
                      local_1288 = fVar203;
                      fStack_1284 = fVar136;
                      fStack_1280 = fVar268;
                      fStack_127c = fVar270;
                      pRVar59 = local_12d0;
                      _local_1308 = auVar242;
                      while( true ) {
                        local_120c = local_1118[lVar53];
                        local_1208 = local_1108[lVar53];
                        *(float *)&(((Intersectors *)ray)->intersector1).intersect =
                             local_10f8[lVar53];
                        local_1218 = *(int *)(local_10e8 + lVar53 * 4);
                        local_1214 = local_10d8[lVar53];
                        local_1210 = local_10c8[lVar53];
                        local_1204 = (int)local_12a8;
                        local_1200 = (int)local_12f8;
                        local_11fc = *(undefined4 *)&local_11a8->scene;
                        local_11f8 = *(undefined4 *)((long)&local_11a8->scene + 4);
                        local_130c = (undefined1  [4])0xffffffff;
                        local_1248.valid = (int *)local_130c;
                        local_1248.geometryUserPtr = (This->collider).name;
                        local_1248.context = (RTCRayQueryContext *)local_11a8;
                        local_1248.ray = (RTCRayN *)ray;
                        local_1248.hit = (RTCHitN *)&local_1218;
                        local_1248.N = 1;
                        p_Var15 = (This->intersector4).intersect;
                        if (((p_Var15 == (IntersectFunc4)0x0) ||
                            ((*p_Var15)(&local_1248,(Intersectors *)ray,pRVar59,local_11a8),
                            pRVar59 = extraout_RDX, ray = (RayHit *)local_12f0, This = local_1298,
                            fVar203 = local_1288, fVar136 = fStack_1284, fVar268 = fStack_1280,
                            fVar270 = fStack_127c, *(int *)(AccelData **)local_1248.valid != 0)) &&
                           ((local_11b8->filter == (RTCFilterFunctionN)0x0 ||
                            ((((local_11b8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                               RTC_RAY_QUERY_FLAG_INCOHERENT &&
                              (((ulong)(This->intersector1).name & 0x40000000000000) == 0)) ||
                             ((*local_11b8->filter)(&local_1248), pRVar59 = extraout_RDX_00,
                             ray = (RayHit *)local_12f0, This = local_1298, fVar203 = local_1288,
                             fVar136 = fStack_1284, fVar268 = fStack_1280, fVar270 = fStack_127c,
                             *(int *)(AccelData **)local_1248.valid != 0)))))) {
                          *(int *)&((Intersector1 *)((long)local_1248.ray + 0x20))->pointQuery =
                               *(int *)local_1248.hit;
                          *(int *)((long)&((Intersector1 *)((long)local_1248.ray + 0x20))->
                                          pointQuery + 4) = *(int *)(local_1248.hit + 4);
                          *(int *)&((Intersector1 *)((long)local_1248.ray + 0x20))->name =
                               *(int *)(local_1248.hit + 8);
                          *(int *)((long)&((Intersector1 *)((long)local_1248.ray + 0x20))->name + 4)
                               = *(int *)(local_1248.hit + 0xc);
                          *(int *)&((Intersector4 *)((long)local_1248.ray + 0x40))->intersect =
                               *(int *)(local_1248.hit + 0x10);
                          *(int *)((long)&((Intersector4 *)((long)local_1248.ray + 0x40))->intersect
                                  + 4) = *(int *)(local_1248.hit + 0x14);
                          *(int *)&((Intersector4 *)((long)local_1248.ray + 0x40))->occluded =
                               *(int *)(local_1248.hit + 0x18);
                          pRVar59 = (RTCRayHit4 *)(ulong)*(uint *)(local_1248.hit + 0x1c);
                          *(uint *)((long)&((Intersector4 *)((long)local_1248.ray + 0x40))->occluded
                                   + 4) = *(uint *)(local_1248.hit + 0x1c);
                          *(int *)&((Intersector4 *)((long)local_1248.ray + 0x40))->name =
                               *(int *)(local_1248.hit + 0x20);
                          pIVar60 = (Intersectors *)local_1248.ray;
                        }
                        else {
                          *(undefined4 *)&(local_12f0->intersector1).intersect = local_11e8._0_4_;
                          pIVar60 = (Intersectors *)local_1248.valid;
                          ray = (RayHit *)local_12f0;
                          This = local_1298;
                          fVar203 = local_1288;
                          fVar136 = fStack_1284;
                          fVar268 = fStack_1280;
                          fVar270 = fStack_127c;
                        }
                        *(undefined4 *)(local_1258 + lVar53 * 4) = 0;
                        pIVar1 = &((Intersectors *)ray)->intersector1;
                        fVar286 = *(float *)&pIVar1->intersect;
                        auVar96._0_4_ = -(uint)(fVar203 <= fVar286) & local_1258._0_4_;
                        auVar96._4_4_ = -(uint)(fVar136 <= fVar286) & local_1258._4_4_;
                        auVar96._8_4_ = -(uint)(fVar268 <= fVar286) & local_1258._8_4_;
                        auVar96._12_4_ = -(uint)(fVar270 <= fVar286) & local_1258._12_4_;
                        local_1258 = auVar96;
                        iVar56 = movmskps((int)pIVar60,auVar96);
                        if (iVar56 == 0) break;
                        auVar130._0_4_ = auVar96._0_4_ & (uint)fVar203;
                        auVar130._4_4_ = auVar96._4_4_ & (uint)fVar136;
                        auVar130._8_4_ = auVar96._8_4_ & (uint)fVar268;
                        auVar130._12_4_ = auVar96._12_4_ & (uint)fVar270;
                        auVar158._0_8_ =
                             CONCAT44(~auVar96._4_4_,~auVar96._0_4_) & 0x7f8000007f800000;
                        auVar158._8_4_ = ~auVar96._8_4_ & 0x7f800000;
                        auVar158._12_4_ = ~auVar96._12_4_ & 0x7f800000;
                        auVar158 = auVar158 | auVar130;
                        auVar195._4_4_ = auVar158._0_4_;
                        auVar195._0_4_ = auVar158._4_4_;
                        auVar195._8_4_ = auVar158._12_4_;
                        auVar195._12_4_ = auVar158._8_4_;
                        auVar108 = minps(auVar195,auVar158);
                        auVar131._0_8_ = auVar108._8_8_;
                        auVar131._8_4_ = auVar108._0_4_;
                        auVar131._12_4_ = auVar108._4_4_;
                        auVar108 = minps(auVar131,auVar108);
                        auVar132._0_8_ =
                             CONCAT44(-(uint)(auVar108._4_4_ == auVar158._4_4_) & auVar96._4_4_,
                                      -(uint)(auVar108._0_4_ == auVar158._0_4_) & auVar96._0_4_);
                        auVar132._8_4_ = -(uint)(auVar108._8_4_ == auVar158._8_4_) & auVar96._8_4_;
                        auVar132._12_4_ =
                             -(uint)(auVar108._12_4_ == auVar158._12_4_) & auVar96._12_4_;
                        iVar56 = movmskps(iVar56,auVar132);
                        if (iVar56 != 0) {
                          auVar96._8_4_ = auVar132._8_4_;
                          auVar96._0_8_ = auVar132._0_8_;
                          auVar96._12_4_ = auVar132._12_4_;
                        }
                        local_11e8 = (undefined1  [8])pIVar1->intersect;
                        _fStack_11e0 = pIVar1->occluded;
                        uVar51 = movmskps(iVar56,auVar96);
                        uVar68 = CONCAT44((int)((ulong)pIVar60 >> 0x20),uVar51);
                        lVar53 = 0;
                        if (uVar68 != 0) {
                          for (; (uVar68 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                          }
                        }
                      }
                      local_1298._0_4_ =
                           (((RayK<1> *)&((Intersectors *)ray)->ptr)->org).field_0.m128[0];
                      local_1028 = (((RayK<1> *)&((Intersectors *)ray)->ptr)->org).field_0.m128[1];
                      local_1288 = *(float *)&((Intersectors *)ray)->leafIntersector;
                      local_11a8._0_4_ =
                           ((anon_union_16_2_47237d3f_for_Vec3fx_0 *)
                           &(((Intersectors *)ray)->collider).collide)->m128[0];
                      fVar240 = ((anon_union_16_2_47237d3f_for_Vec3fx_0 *)
                                &(((Intersectors *)ray)->collider).collide)->m128[1];
                      local_11e8._4_4_ = *(undefined4 *)&(((Intersectors *)ray)->collider).name;
                      local_1298._4_4_ = (float)local_1298;
                      fStack_1290 = (float)local_1298;
                      fStack_128c = (float)local_1298;
                      fStack_1024 = local_1028;
                      fStack_1020 = local_1028;
                      fStack_101c = local_1028;
                      fStack_1284 = local_1288;
                      fStack_1280 = local_1288;
                      fStack_127c = local_1288;
                      local_11a8._4_4_ = (float)local_11a8;
                      fStack_11a0 = (float)local_11a8;
                      fStack_119c = (float)local_11a8;
                      local_11e8._0_4_ = local_11e8._4_4_;
                      fStack_11e0 = (float)local_11e8._4_4_;
                      fStack_11dc = (float)local_11e8._4_4_;
                      uVar71 = 0;
                    }
                    fVar284 = (float)local_1198;
                    fVar286 = local_1198._4_4_;
                  }
                  fVar284 = (float)local_12c8 - fVar284;
                  fVar286 = local_12c8._4_4_ - fVar286;
                  fVar275 = fStack_12c0 - fStack_1190;
                  fVar277 = fStack_12bc - fStack_118c;
                  local_1278 = (float)local_12b8 - local_1278;
                  fStack_1274 = local_12b8._4_4_ - fStack_1274;
                  fStack_1270 = fStack_12b0 - fStack_1270;
                  fStack_126c = fStack_12ac - fStack_126c;
                  fVar255 = (float)local_12e8 - local_1268;
                  fVar256 = local_12e8._4_4_ - fStack_1264;
                  fVar257 = fStack_12e0 - fStack_1260;
                  fVar258 = fStack_12dc - fStack_125c;
                  fVar246 = (float)local_1308._0_4_ - (float)local_12c8;
                  fVar248 = (float)local_1308._4_4_ - local_12c8._4_4_;
                  fVar252 = fStack_1300 - fStack_12c0;
                  fVar254 = fStack_12fc - fStack_12bc;
                  fVar220 = local_f98 - (float)local_12b8;
                  fVar221 = fStack_f94 - local_12b8._4_4_;
                  fVar235 = fStack_f90 - fStack_12b0;
                  fVar238 = fStack_f8c - fStack_12ac;
                  fVar203 = (float)local_1188._0_4_ - (float)local_12e8;
                  fVar136 = (float)local_1188._4_4_ - local_12e8._4_4_;
                  fVar244 = (float)uStack_1180 - fStack_12e0;
                  fVar245 = uStack_1180._4_4_ - fStack_12dc;
                  local_10e8._0_4_ = fVar220 * fVar255 - fVar203 * local_1278;
                  local_10e8._4_4_ = fVar221 * fVar256 - fVar136 * fStack_1274;
                  fStack_10e0 = fVar235 * fVar257 - fVar244 * fStack_1270;
                  fStack_10dc = fVar238 * fVar258 - fVar245 * fStack_126c;
                  local_1268 = fVar284;
                  fStack_1264 = fVar286;
                  fStack_1260 = fVar275;
                  fStack_125c = fVar277;
                  local_1308._0_4_ = fVar203 * fVar284 - fVar246 * fVar255;
                  local_1308._4_4_ = fVar136 * fVar286 - fVar248 * fVar256;
                  fStack_1300 = fVar244 * fVar275 - fVar252 * fVar257;
                  fStack_12fc = fVar245 * fVar277 - fVar254 * fVar258;
                  fVar273 = fVar246 * local_1278 - fVar220 * fVar284;
                  fVar274 = fVar248 * fStack_1274 - fVar221 * fVar286;
                  fVar276 = fVar252 * fStack_1270 - fVar235 * fVar275;
                  fVar278 = fVar254 * fStack_126c - fVar238 * fVar277;
                  local_12c8._0_4_ = (float)local_12c8 - local_1298._4_4_;
                  local_12c8._4_4_ = local_12c8._4_4_ - local_1298._4_4_;
                  fStack_12c0 = fStack_12c0 - local_1298._4_4_;
                  fStack_12bc = fStack_12bc - local_1298._4_4_;
                  local_12b8._0_4_ = (float)local_12b8 - fStack_101c;
                  local_12b8._4_4_ = local_12b8._4_4_ - fStack_101c;
                  fStack_12b0 = fStack_12b0 - fStack_101c;
                  fStack_12ac = fStack_12ac - fStack_101c;
                  fVar266 = (float)local_12e8 - fStack_127c;
                  fVar269 = local_12e8._4_4_ - fStack_127c;
                  fVar271 = fStack_12e0 - fStack_127c;
                  fVar272 = fStack_12dc - fStack_127c;
                  fVar268 = (float)local_12b8 * (float)local_11e8._0_4_ - fVar266 * fVar240;
                  fVar270 = local_12b8._4_4_ * (float)local_11e8._4_4_ - fVar269 * fVar240;
                  fVar197 = fStack_12b0 * fStack_11e0 - fVar271 * fVar240;
                  fVar237 = fStack_12ac * fStack_11dc - fVar272 * fVar240;
                  fVar160 = fVar266 * local_11a8._4_4_ - (float)local_12c8 * (float)local_11e8._0_4_
                  ;
                  fVar161 = fVar269 * local_11a8._4_4_ - local_12c8._4_4_ * (float)local_11e8._4_4_;
                  fVar162 = fVar271 * local_11a8._4_4_ - fStack_12c0 * fStack_11e0;
                  fVar250 = fVar272 * local_11a8._4_4_ - fStack_12bc * fStack_11dc;
                  fVar259 = (float)local_12c8 * fVar240 - (float)local_12b8 * local_11a8._4_4_;
                  fVar260 = local_12c8._4_4_ * fVar240 - local_12b8._4_4_ * local_11a8._4_4_;
                  fVar262 = fStack_12c0 * fVar240 - fStack_12b0 * local_11a8._4_4_;
                  fVar264 = fStack_12bc * fVar240 - fStack_12ac * local_11a8._4_4_;
                  local_12e8._4_4_ = fVar274;
                  local_12e8._0_4_ = fVar273;
                  fStack_12e0 = fVar276;
                  fStack_12dc = fVar278;
                  fVar239 = local_11a8._4_4_ * (float)local_10e8._0_4_ +
                            fVar240 * (float)local_1308._0_4_ + (float)local_11e8._0_4_ * fVar273;
                  fVar241 = local_11a8._4_4_ * (float)local_10e8._4_4_ +
                            fVar240 * (float)local_1308._4_4_ + (float)local_11e8._4_4_ * fVar274;
                  fVar247 = local_11a8._4_4_ * fStack_10e0 +
                            fVar240 * fStack_1300 + fStack_11e0 * fVar276;
                  fVar240 = local_11a8._4_4_ * fStack_10dc +
                            fVar240 * fStack_12fc + fStack_11dc * fVar278;
                  fVar203 = fVar203 * fVar259;
                  in_XMM8_Ba = SUB41(fVar203,0);
                  in_XMM8_Bb = (undefined1)((uint)fVar203 >> 8);
                  in_XMM8_Bc = (undefined1)((uint)fVar203 >> 0x10);
                  in_XMM8_Bd = (undefined1)((uint)fVar203 >> 0x18);
                  fVar136 = fVar136 * fVar260;
                  in_XMM8_Be = SUB41(fVar136,0);
                  in_XMM8_Bf = (undefined1)((uint)fVar136 >> 8);
                  in_XMM8_Bg = (undefined1)((uint)fVar136 >> 0x10);
                  in_XMM8_Bh = (undefined1)((uint)fVar136 >> 0x18);
                  uVar72 = (uint)fVar239 & 0x80000000;
                  uVar73 = (uint)fVar241 & 0x80000000;
                  uVar74 = (uint)fVar247 & 0x80000000;
                  uVar253 = (uint)fVar240 & 0x80000000;
                  fVar249 = (float)((uint)(fVar246 * fVar268 + fVar220 * fVar160 + fVar203) ^ uVar72
                                   );
                  fVar251 = (float)((uint)(fVar248 * fVar270 + fVar221 * fVar161 + fVar136) ^ uVar73
                                   );
                  fVar252 = (float)((uint)(fVar252 * fVar197 + fVar235 * fVar162 + fVar244 * fVar262
                                          ) ^ uVar74);
                  fVar254 = (float)((uint)(fVar254 * fVar237 + fVar238 * fVar250 + fVar245 * fVar264
                                          ) ^ uVar253);
                  fVar268 = (float)((uint)(fVar268 * fVar284 +
                                          fVar160 * local_1278 + fVar259 * fVar255) ^ uVar72);
                  fVar270 = (float)((uint)(fVar270 * fVar286 +
                                          fVar161 * fStack_1274 + fVar260 * fVar256) ^ uVar73);
                  fVar284 = (float)((uint)(fVar197 * fVar275 +
                                          fVar162 * fStack_1270 + fVar262 * fVar257) ^ uVar74);
                  fVar197 = (float)((uint)(fVar237 * fVar277 +
                                          fVar250 * fStack_126c + fVar264 * fVar258) ^ uVar253);
                  fVar286 = ABS(fVar239);
                  fVar203 = ABS(fVar241);
                  local_1148 = (undefined1  [8])(CONCAT44(fVar241,fVar239) & 0x7fffffff7fffffff);
                  fStack_1140 = ABS(fVar247);
                  fStack_113c = ABS(fVar240);
                  auVar201._0_4_ =
                       -(uint)((0.0 <= fVar249 && 0.0 <= fVar268) && fVar239 != 0.0) & local_1018 &
                       -(uint)(fVar249 + fVar268 <= fVar286);
                  auVar201._4_4_ =
                       -(uint)((0.0 <= fVar251 && 0.0 <= fVar270) && fVar241 != 0.0) & uStack_1014 &
                       -(uint)(fVar251 + fVar270 <= fVar203);
                  auVar201._8_4_ =
                       -(uint)((0.0 <= fVar252 && 0.0 <= fVar284) && fVar247 != 0.0) & uStack_1010 &
                       -(uint)(fVar252 + fVar284 <= fStack_1140);
                  auVar201._12_4_ =
                       -(uint)((0.0 <= fVar254 && 0.0 <= fVar197) && fVar240 != 0.0) & uStack_100c &
                       -(uint)(fVar254 + fVar197 <= fStack_113c);
                  iVar56 = movmskps(uVar71,auVar201);
                  context = (RayQueryContext *)local_12d0;
                  uVar68 = local_1058;
                  uVar70 = local_12a0;
                  auVar242 = local_fa8;
                  fVar160 = local_fd8;
                  fVar161 = fStack_fd4;
                  fVar162 = fStack_fd0;
                  fVar250 = fStack_fcc;
                  fVar220 = local_fe8;
                  fVar221 = fStack_fe4;
                  fVar235 = fStack_fe0;
                  fVar136 = fStack_fdc;
                  fVar238 = local_ff8;
                  fVar239 = fStack_ff4;
                  fVar241 = fStack_ff0;
                  fVar247 = fStack_fec;
                  fVar244 = local_1008;
                  fVar245 = fStack_1004;
                  fVar246 = fStack_1000;
                  fVar248 = fStack_ffc;
                  if (iVar56 != 0) {
                    local_1158 = (float)(uVar72 ^ (uint)((float)local_12c8 * (float)local_10e8._0_4_
                                                        + (float)local_12b8 *
                                                          (float)local_1308._0_4_ +
                                                          fVar266 * fVar273));
                    fStack_1154 = (float)(uVar73 ^ (uint)(local_12c8._4_4_ * (float)local_10e8._4_4_
                                                         + local_12b8._4_4_ *
                                                           (float)local_1308._4_4_ +
                                                           fVar269 * fVar274));
                    fStack_1150 = (float)(uVar74 ^ (uint)(fStack_12c0 * fStack_10e0 +
                                                         fStack_12b0 * fStack_1300 +
                                                         fVar271 * fVar276));
                    fStack_114c = (float)(uVar253 ^
                                         (uint)(fStack_12bc * fStack_10dc +
                                               fStack_12ac * fStack_12fc + fVar272 * fVar278));
                    fVar237 = *(float *)((long)&((Intersectors *)ray)->leafIntersector + 4);
                    auVar6._0_8_ = (((Intersectors *)ray)->intersector1).intersect;
                    auVar6._8_8_ = (((Intersectors *)ray)->intersector1).occluded;
                    fVar240 = (float)auVar6._0_8_;
                    uVar71 = (uint)((ulong)auVar6._0_8_ >> 0x20);
                    auVar95._0_4_ =
                         -(uint)(local_1158 <= fVar240 * fVar286 && fVar237 * fVar286 < local_1158)
                         & auVar201._0_4_;
                    auVar95._4_4_ =
                         -(uint)(fStack_1154 <= fVar240 * fVar203 && fVar237 * fVar203 < fStack_1154
                                ) & auVar201._4_4_;
                    auVar95._8_4_ =
                         -(uint)(fStack_1150 <= fVar240 * fStack_1140 &&
                                fVar237 * fStack_1140 < fStack_1150) & auVar201._8_4_;
                    auVar95._12_4_ =
                         -(uint)(fStack_114c <= fVar240 * fStack_113c &&
                                fVar237 * fStack_113c < fStack_114c) & auVar201._12_4_;
                    iVar56 = movmskps(iVar56,auVar95);
                    if (iVar56 != 0) {
                      local_1128 = auVar95;
                      local_10d8[0] = (float)local_1308._0_4_;
                      local_10d8[1] = (float)local_1308._4_4_;
                      local_10d8._8_8_ = _fStack_1300;
                      local_10c8 = (float  [2])local_12e8;
                      uStack_10c0 = CONCAT44(fVar278,fVar276);
                      auVar202._0_4_ = fVar286 - fVar268;
                      auVar202._4_4_ = fVar203 - fVar270;
                      auVar202._8_4_ = fStack_1140 - fVar284;
                      auVar202._12_4_ = fStack_113c - fVar197;
                      fVar268 = (float)(int)(*(ushort *)(local_11d0 + 8 + lVar69) - 1);
                      auVar108 = rcpss(ZEXT416((uint)fVar268),ZEXT416((uint)fVar268));
                      fVar270 = (float)(int)(*(ushort *)(local_11d0 + 10 + lVar69) - 1);
                      fVar284 = (2.0 - fVar268 * auVar108._0_4_) * auVar108._0_4_;
                      auVar243._4_4_ = fVar256;
                      auVar243._0_4_ = fVar270;
                      auVar243._8_4_ = fVar257;
                      auVar243._12_4_ = fVar258;
                      auVar24._4_4_ = fVar256;
                      auVar24._0_4_ = fVar270;
                      auVar24._8_4_ = fVar257;
                      auVar24._12_4_ = fVar258;
                      auVar108 = rcpss(auVar243,auVar24);
                      fVar197 = (2.0 - fVar270 * auVar108._0_4_) * auVar108._0_4_;
                      fVar268 = (float)(int)local_1038._0_4_ * fVar286 + (fVar286 - fVar249);
                      in_XMM8_Ba = SUB41(fVar268,0);
                      in_XMM8_Bb = (undefined1)((uint)fVar268 >> 8);
                      in_XMM8_Bc = (undefined1)((uint)fVar268 >> 0x10);
                      in_XMM8_Bd = (undefined1)((uint)fVar268 >> 0x18);
                      fVar270 = (float)(local_1038._0_4_ + 1) * fVar203 + (fVar203 - fVar251);
                      in_XMM8_Be = SUB41(fVar270,0);
                      in_XMM8_Bf = (undefined1)((uint)fVar270 >> 8);
                      in_XMM8_Bg = (undefined1)((uint)fVar270 >> 0x10);
                      in_XMM8_Bh = (undefined1)((uint)fVar270 >> 0x18);
                      local_1178._0_4_ = fVar284 * fVar268;
                      local_1178._4_4_ = fVar284 * fVar270;
                      fStack_1170 = fVar284 * ((float)(local_1038._0_4_ + 1) * fStack_1140 +
                                              (fStack_1140 - fVar252));
                      fStack_116c = fVar284 * ((float)(int)local_1038._0_4_ * fStack_113c +
                                              (fStack_113c - fVar254));
                      local_1168._0_4_ =
                           fVar197 * ((float)(int)local_1038._4_4_ * fVar286 + auVar202._0_4_);
                      local_1168._4_4_ =
                           fVar197 * ((float)(int)local_1038._4_4_ * fVar203 + auVar202._4_4_);
                      fStack_1160 = fVar197 * ((float)(local_1038._4_4_ + 1) * fStack_1140 +
                                              auVar202._8_4_);
                      fStack_115c = fVar197 * ((float)(local_1038._4_4_ + 1) * fStack_113c +
                                              auVar202._12_4_);
                      pIVar60 = (Intersectors *)
                                ((*(Scene **)(local_12d0->ray).org_x)->geometries).items
                                [(long)local_12f8].ptr;
                      This = local_12f8;
                      if ((*(uint *)((long)&(pIVar60->intersector1).pointQuery + 4) & uVar71) != 0)
                      {
                        local_1258 = auVar95;
                        auVar108 = rcpps(auVar202,_local_1148);
                        fVar268 = auVar108._0_4_;
                        fVar270 = auVar108._4_4_;
                        fVar284 = auVar108._8_4_;
                        fVar197 = auVar108._12_4_;
                        fVar268 = (1.0 - fVar286 * fVar268) * fVar268 + fVar268;
                        fVar270 = (1.0 - fVar203 * fVar270) * fVar270 + fVar270;
                        fVar284 = (1.0 - fStack_1140 * fVar284) * fVar284 + fVar284;
                        fVar197 = (1.0 - fStack_113c * fVar197) * fVar197 + fVar197;
                        local_10f8[0] = local_1158 * fVar268;
                        local_10f8[1] = fStack_1154 * fVar270;
                        local_10f8[2] = fStack_1150 * fVar284;
                        local_10f8[3] = fStack_114c * fVar197;
                        local_1118[0] = (float)local_1178._0_4_ * fVar268;
                        local_1118[1] = (float)local_1178._4_4_ * fVar270;
                        local_1118[2] = fStack_1170 * fVar284;
                        local_1118[3] = fStack_116c * fVar197;
                        local_1108[0] = (float)local_1168._0_4_ * fVar268;
                        local_1108[1] = (float)local_1168._4_4_ * fVar270;
                        local_1108[2] = fStack_1160 * fVar284;
                        local_1108[3] = fStack_115c * fVar197;
                        auVar155._0_8_ =
                             CONCAT44(~auVar95._4_4_,~auVar95._0_4_) & 0x7f8000007f800000;
                        auVar155._8_4_ = ~auVar95._8_4_ & 0x7f800000;
                        auVar155._12_4_ = ~auVar95._12_4_ & 0x7f800000;
                        auVar25._4_4_ = (uint)local_10f8[1] & auVar95._4_4_;
                        auVar25._0_4_ = (uint)local_10f8[0] & auVar95._0_4_;
                        auVar25._8_4_ = (uint)local_10f8[2] & auVar95._8_4_;
                        auVar25._12_4_ = (uint)local_10f8[3] & auVar95._12_4_;
                        auVar155 = auVar155 | auVar25;
                        auVar193._4_4_ = auVar155._0_4_;
                        auVar193._0_4_ = auVar155._4_4_;
                        auVar193._8_4_ = auVar155._12_4_;
                        auVar193._12_4_ = auVar155._8_4_;
                        auVar108 = minps(auVar193,auVar155);
                        auVar126._0_8_ = auVar108._8_8_;
                        auVar126._8_4_ = auVar108._0_4_;
                        auVar126._12_4_ = auVar108._4_4_;
                        auVar108 = minps(auVar126,auVar108);
                        auVar127._0_8_ =
                             CONCAT44(-(uint)(auVar108._4_4_ == auVar155._4_4_) & auVar95._4_4_,
                                      -(uint)(auVar108._0_4_ == auVar155._0_4_) & auVar95._0_4_);
                        auVar127._8_4_ = -(uint)(auVar108._8_4_ == auVar155._8_4_) & auVar95._8_4_;
                        auVar127._12_4_ =
                             -(uint)(auVar108._12_4_ == auVar155._12_4_) & auVar95._12_4_;
                        iVar56 = movmskps(uVar71,auVar127);
                        if (iVar56 != 0) {
                          auVar95._8_4_ = auVar127._8_4_;
                          auVar95._0_8_ = auVar127._0_8_;
                          auVar95._12_4_ = auVar127._12_4_;
                        }
                        uVar71 = movmskps(iVar56,auVar95);
                        lVar53 = 0;
                        if (uVar71 != 0) {
                          for (; (uVar71 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                          }
                        }
                        local_12b8 = *(Intersectors **)(local_12d0->ray).org_y;
                        local_12c8 = pIVar60;
                        if ((Device *)(local_12b8->collider).collide == (Device *)0x0) {
                          local_12e8 = *(Intersectors **)((long)(local_12d0->ray).org_x + 8);
                          if ((pIVar60->intersector4).intersect == (IntersectFunc4)0x0) {
                            fVar286 = local_1118[lVar53];
                            fVar203 = local_1108[lVar53];
                            uVar51 = *(undefined4 *)(local_10e8 + lVar53 * 4);
                            fVar268 = local_10d8[lVar53];
                            fVar270 = local_10c8[lVar53];
                            *(float *)&(((Intersectors *)ray)->intersector1).intersect =
                                 local_10f8[lVar53];
                            *(undefined4 *)&(((Intersectors *)ray)->intersector1).pointQuery =
                                 uVar51;
                            *(float *)((long)&(((Intersectors *)ray)->intersector1).pointQuery + 4)
                                 = fVar268;
                            *(float *)&(((Intersectors *)ray)->intersector1).name = fVar270;
                            *(float *)((long)&(((Intersectors *)ray)->intersector1).name + 4) =
                                 fVar286;
                            *(float *)&(((Intersectors *)ray)->intersector4).intersect = fVar203;
                            *(uint *)((long)&(((Intersectors *)ray)->intersector4).intersect + 4) =
                                 (uint)local_12a8;
                            *(uint *)&(((Intersectors *)ray)->intersector4).occluded =
                                 (uint)local_12f8;
                            *(uint *)((long)&(((Intersectors *)ray)->intersector4).occluded + 4) =
                                 *(uint *)&((RefCount *)&local_12e8->ptr)->_vptr_RefCount;
                            *(uint *)&(((Intersectors *)ray)->intersector4).name =
                                 *(uint *)((long)&((RefCount *)&local_12e8->ptr)->_vptr_RefCount + 4
                                          );
                            goto LAB_00d25616;
                          }
                          _local_1308 = auVar6;
                          pIVar58 = local_12e8;
                        }
                        else {
                          _local_1308 = auVar6;
                          local_12e8 = *(Intersectors **)((long)(local_12d0->ray).org_x + 8);
                          pIVar58 = pIVar60;
                        }
                        auVar219._4_4_ = local_10f8[1];
                        auVar219._0_4_ = local_10f8[0];
                        auVar219._8_4_ = local_10f8[2];
                        auVar219._12_4_ = local_10f8[3];
                        _local_1188 = auVar219;
                        pRVar59 = local_12d0;
                        ray = (RayHit *)local_12f0;
                        pIVar64 = local_12e8;
                        _local_1308 = auVar6;
                        fStack_1290 = local_1298._4_4_;
                        fStack_128c = local_1298._4_4_;
                        local_1288 = fStack_127c;
                        fStack_1284 = fStack_127c;
                        fStack_1280 = fStack_127c;
                        fStack_11a0 = local_11a8._4_4_;
                        fStack_119c = local_11a8._4_4_;
                        local_1028 = fStack_101c;
                        fStack_1024 = fStack_101c;
                        fStack_1020 = fStack_101c;
                        local_11a8._0_4_ = local_11a8._4_4_;
                        local_1298._0_4_ = local_1298._4_4_;
                        while( true ) {
                          local_120c = local_1118[lVar53];
                          local_1208 = local_1108[lVar53];
                          *(float *)&(((Intersectors *)ray)->intersector1).intersect =
                               local_10f8[lVar53];
                          local_1218 = *(int *)(local_10e8 + lVar53 * 4);
                          local_1214 = local_10d8[lVar53];
                          local_1210 = local_10c8[lVar53];
                          local_1204 = (int)local_12a8;
                          local_1200 = (int)local_12f8;
                          local_11fc = *(undefined4 *)&((RefCount *)&pIVar64->ptr)->_vptr_RefCount;
                          local_11f8 = *(undefined4 *)
                                        ((long)&((RefCount *)&pIVar64->ptr)->_vptr_RefCount + 4);
                          local_130c = (undefined1  [4])0xffffffff;
                          local_1248.valid = (int *)local_130c;
                          local_1248.geometryUserPtr = (pIVar60->collider).name;
                          local_1248.context = (RTCRayQueryContext *)pIVar64;
                          local_1248.ray = (RTCRayN *)ray;
                          local_1248.hit = (RTCHitN *)&local_1218;
                          local_1248.N = 1;
                          p_Var15 = (pIVar60->intersector4).intersect;
                          if (((p_Var15 == (IntersectFunc4)0x0) ||
                              ((*p_Var15)(&local_1248,(Intersectors *)ray,pRVar59,
                                          (RayQueryContext *)pIVar58), pRVar59 = extraout_RDX_01,
                              ray = (RayHit *)local_12f0, pIVar60 = local_12c8, pIVar64 = local_12e8
                              , auVar219 = _local_1188, *(int *)(AccelData **)local_1248.valid != 0)
                              ) && (((pDVar16 = (Device *)(local_12b8->collider).collide,
                                     pDVar16 == (Device *)0x0 ||
                                     ((((ulong)((RefCount *)&local_12b8->ptr)->_vptr_RefCount & 2)
                                       == 0 && (((ulong)(pIVar60->intersector1).name &
                                                0x40000000000000) == 0)))) ||
                                    (pIVar58 = local_12b8, (*(code *)pDVar16)(&local_1248),
                                    pRVar59 = extraout_RDX_02, ray = (RayHit *)local_12f0,
                                    pIVar60 = local_12c8, pIVar64 = local_12e8,
                                    auVar219 = _local_1188,
                                    *(int *)(AccelData **)local_1248.valid != 0)))) {
                            *(int *)&((Intersector1 *)((long)local_1248.ray + 0x20))->pointQuery =
                                 *(int *)local_1248.hit;
                            *(int *)((long)&((Intersector1 *)((long)local_1248.ray + 0x20))->
                                            pointQuery + 4) = *(int *)(local_1248.hit + 4);
                            *(int *)&((Intersector1 *)((long)local_1248.ray + 0x20))->name =
                                 *(int *)(local_1248.hit + 8);
                            *(int *)((long)&((Intersector1 *)((long)local_1248.ray + 0x20))->name +
                                    4) = *(int *)(local_1248.hit + 0xc);
                            *(int *)&((Intersector4 *)((long)local_1248.ray + 0x40))->intersect =
                                 *(int *)(local_1248.hit + 0x10);
                            *(int *)((long)&((Intersector4 *)((long)local_1248.ray + 0x40))->
                                            intersect + 4) = *(int *)(local_1248.hit + 0x14);
                            *(int *)&((Intersector4 *)((long)local_1248.ray + 0x40))->occluded =
                                 *(int *)(local_1248.hit + 0x18);
                            pRVar59 = (RTCRayHit4 *)(ulong)*(uint *)(local_1248.hit + 0x1c);
                            *(uint *)((long)&((Intersector4 *)((long)local_1248.ray + 0x40))->
                                             occluded + 4) = *(uint *)(local_1248.hit + 0x1c);
                            pIVar58 = (Intersectors *)(ulong)*(uint *)(local_1248.hit + 0x20);
                            *(uint *)&((Intersector4 *)((long)local_1248.ray + 0x40))->name =
                                 *(uint *)(local_1248.hit + 0x20);
                            pIVar55 = (Intersectors *)local_1248.ray;
                          }
                          else {
                            *(undefined4 *)&(local_12f0->intersector1).intersect = local_1308._0_4_;
                            pIVar55 = (Intersectors *)local_1248.valid;
                            ray = (RayHit *)local_12f0;
                            pIVar60 = local_12c8;
                            pIVar64 = local_12e8;
                            auVar219 = _local_1188;
                          }
                          *(undefined4 *)(local_1258 + lVar53 * 4) = 0;
                          auVar7._0_8_ = (((Intersectors *)ray)->intersector1).intersect;
                          auVar7._8_8_ = (((Intersectors *)ray)->intersector1).occluded;
                          fVar286 = (float)auVar7._0_8_;
                          auVar97._0_4_ = -(uint)(auVar219._0_4_ <= fVar286) & local_1258._0_4_;
                          auVar97._4_4_ = -(uint)(auVar219._4_4_ <= fVar286) & local_1258._4_4_;
                          auVar97._8_4_ = -(uint)(auVar219._8_4_ <= fVar286) & local_1258._8_4_;
                          auVar97._12_4_ = -(uint)(auVar219._12_4_ <= fVar286) & local_1258._12_4_;
                          local_1258 = auVar97;
                          iVar56 = movmskps((int)pIVar55,auVar97);
                          context = (RayQueryContext *)local_12d0;
                          This = pIVar60;
                          uVar68 = local_1058;
                          uVar70 = local_12a0;
                          auVar242 = local_fa8;
                          fVar160 = local_fd8;
                          fVar161 = fStack_fd4;
                          fVar162 = fStack_fd0;
                          fVar250 = fStack_fcc;
                          fVar220 = local_fe8;
                          fVar221 = fStack_fe4;
                          fVar235 = fStack_fe0;
                          fVar136 = fStack_fdc;
                          fVar238 = local_ff8;
                          fVar239 = fStack_ff4;
                          fVar241 = fStack_ff0;
                          fVar247 = fStack_fec;
                          fVar244 = local_1008;
                          fVar245 = fStack_1004;
                          fVar246 = fStack_1000;
                          fVar248 = fStack_ffc;
                          if (iVar56 == 0) break;
                          auVar133._0_4_ = auVar97._0_4_ & (uint)auVar219._0_4_;
                          auVar133._4_4_ = auVar97._4_4_ & (uint)auVar219._4_4_;
                          auVar133._8_4_ = auVar97._8_4_ & (uint)auVar219._8_4_;
                          auVar133._12_4_ = auVar97._12_4_ & (uint)auVar219._12_4_;
                          auVar159._0_8_ =
                               CONCAT44(~auVar97._4_4_,~auVar97._0_4_) & 0x7f8000007f800000;
                          auVar159._8_4_ = ~auVar97._8_4_ & 0x7f800000;
                          auVar159._12_4_ = ~auVar97._12_4_ & 0x7f800000;
                          auVar159 = auVar159 | auVar133;
                          auVar196._4_4_ = auVar159._0_4_;
                          auVar196._0_4_ = auVar159._4_4_;
                          auVar196._8_4_ = auVar159._12_4_;
                          auVar196._12_4_ = auVar159._8_4_;
                          auVar108 = minps(auVar196,auVar159);
                          auVar134._0_8_ = auVar108._8_8_;
                          auVar134._8_4_ = auVar108._0_4_;
                          auVar134._12_4_ = auVar108._4_4_;
                          auVar108 = minps(auVar134,auVar108);
                          auVar135._0_8_ =
                               CONCAT44(-(uint)(auVar108._4_4_ == auVar159._4_4_) & auVar97._4_4_,
                                        -(uint)(auVar108._0_4_ == auVar159._0_4_) & auVar97._0_4_);
                          auVar135._8_4_ = -(uint)(auVar108._8_4_ == auVar159._8_4_) & auVar97._8_4_
                          ;
                          auVar135._12_4_ =
                               -(uint)(auVar108._12_4_ == auVar159._12_4_) & auVar97._12_4_;
                          iVar56 = movmskps(iVar56,auVar135);
                          if (iVar56 != 0) {
                            auVar97._8_4_ = auVar135._8_4_;
                            auVar97._0_8_ = auVar135._0_8_;
                            auVar97._12_4_ = auVar135._12_4_;
                          }
                          _local_1308 = auVar7;
                          uVar51 = movmskps(iVar56,auVar97);
                          uVar68 = CONCAT44((int)((ulong)pIVar55 >> 0x20),uVar51);
                          lVar53 = 0;
                          if (uVar68 != 0) {
                            for (; (uVar68 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                            }
                          }
                        }
                      }
                    }
                  }
                }
LAB_00d25616:
                uVar57 = uVar57 & uVar57 - 1;
              } while (uVar57 != 0);
            }
            local_1060 = local_1060 + 1;
          } while (local_1060 != local_1068);
        }
        fVar286 = *(float *)&(((Intersectors *)ray)->intersector1).intersect;
        auVar242._4_4_ = fVar286;
        auVar242._0_4_ = fVar286;
        auVar242._8_4_ = fVar286;
        auVar242._12_4_ = fVar286;
        uVar61 = local_10a0;
        auVar108 = local_1048;
        fVar203 = local_11c8;
        fVar286 = fStack_11c4;
        fVar270 = fStack_11c0;
        fVar284 = fStack_11bc;
        fVar268 = local_10b8;
        fVar197 = fStack_10b4;
        fVar237 = fStack_10b0;
        fVar240 = fStack_10ac;
      }
    } while (pauVar52 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }